

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_model.cc
# Opt level: O3

bool __thiscall gss::innards::HomomorphismModel::prepare(HomomorphismModel *this)

{
  size_t *psVar1;
  pointer *pppVar2;
  ulong *puVar3;
  byte *pbVar4;
  BitWord *pBVar5;
  undefined1 *puVar6;
  vector<int,_std::allocator<int>_> *pvVar7;
  pointer pvVar8;
  pointer pvVar9;
  pair<int,_int> pVar10;
  BitWord BVar11;
  Proof *pPVar12;
  pointer ppVar13;
  byte bVar14;
  ulong uVar15;
  int iVar16;
  pointer ppVar17;
  int *piVar18;
  bool bVar19;
  uint uVar20;
  _List_node_base *p_Var21;
  SVOBitset *pSVar22;
  pointer ppVar23;
  undefined8 uVar24;
  pointer ppVar25;
  void *__dest;
  value_type *pvVar26;
  ProofError *this_00;
  UnsupportedConfiguration *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar27;
  int iVar28;
  int iVar29;
  _Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false> _Var30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar31;
  uint uVar32;
  ulong uVar33;
  ulong uVar34;
  int *piVar35;
  ulong uVar36;
  char cVar37;
  int iVar38;
  ulong uVar39;
  uint uVar40;
  ulong uVar41;
  long lVar42;
  int iVar43;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  __i;
  long lVar44;
  pointer ppVar45;
  long lVar46;
  uint uVar47;
  long *plVar48;
  int *piVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined4 uVar65;
  uint next_pattern_supplemental;
  uint next_target_supplemental;
  ulong local_4c8;
  ulong local_4c0;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> t_gds;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_4a0;
  char local_490;
  vector<int,_std::allocator<int>_> n_p;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_470;
  size_t local_460;
  long *local_450;
  vector<int,_std::allocator<int>_> n_t;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_430;
  size_t local_420;
  long *local_410;
  NamedVertex named_p_1;
  value_type np;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  targets;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_340 [6];
  uint local_2d8;
  value_type n2_t;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  between_p_and_q;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  named_n_t_w;
  vector<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  named_two_away_from_t;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  patterns;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_1b0 [6];
  uint local_148;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  named_n_t;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> p_gds;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0 [6];
  uint local_88;
  ulong local_80;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  d3_from_t;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  named_d_n_t;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  
  bVar19 = is_nonshrinking(((this->_imp)._M_t.
                            super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                            .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                           _M_head_impl)->params);
  if ((bVar19) && (this->target_size < this->pattern_size)) {
    return false;
  }
  _Var30._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
       .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
  np._data.long_data = (BitWord *)((long)&np._data + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&np,"original","");
  p_Var21 = (_List_node_base *)operator_new(0x30);
  uVar24 = np._data.short_data[1];
  pBVar5 = (BitWord *)((long)&np._data + 0x10);
  p_Var21[1]._M_next = p_Var21 + 2;
  if ((BitWord *)np._data.short_data[0] == pBVar5) {
    p_Var21[2]._M_next =
         (_List_node_base *)CONCAT71(np._data.short_data[2]._1_7_,np._data.short_data[2]._0_1_);
    p_Var21[2]._M_prev = (_List_node_base *)np._data.short_data[3];
  }
  else {
    p_Var21[1]._M_next = (_List_node_base *)np._data.short_data[0];
    p_Var21[2]._M_next =
         (_List_node_base *)CONCAT71(np._data.short_data[2]._1_7_,np._data.short_data[2]._0_1_);
  }
  np._data.short_data[1] = 0;
  np._data.short_data[2]._0_1_ = 0;
  p_Var21[1]._M_prev = (_List_node_base *)uVar24;
  np._data.short_data[0] = (BitWord)pBVar5;
  std::__detail::_List_node_base::_M_hook(p_Var21);
  psVar1 = (size_t *)((long)&(_Var30._M_head_impl)->supplemental_graph_names + 0x10);
  *psVar1 = *psVar1 + 1;
  if ((BitWord *)np._data.short_data[0] != pBVar5) {
    operator_delete(np._data.long_data,
                    CONCAT71(np._data.short_data[2]._1_7_,np._data.short_data[2]._0_1_) + 1);
  }
  _Var30._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
       .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
  pvVar7 = *(vector<int,_std::allocator<int>_> **)
            &((_Var30._M_head_impl)->patterns_degrees).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ;
  if (*(pointer *)((long)&(_Var30._M_head_impl)->patterns_degrees + 8) == pvVar7) {
LAB_00128d21:
    uVar33 = 0;
    uVar34 = 0;
LAB_00128d35:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar34,
               uVar33);
  }
  std::vector<int,_std::allocator<int>_>::resize(pvVar7,(ulong)this->pattern_size);
  _Var30._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
       .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
  pvVar7 = *(vector<int,_std::allocator<int>_> **)
            &((_Var30._M_head_impl)->targets_degrees).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ;
  if (*(pointer *)((long)&(_Var30._M_head_impl)->targets_degrees + 8) == pvVar7) goto LAB_00128d21;
  std::vector<int,_std::allocator<int>_>::resize(pvVar7,(ulong)this->target_size);
  _Var30._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
       .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
  if (this->pattern_size != 0) {
    auVar59 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    lVar44 = *(long *)&((_Var30._M_head_impl)->pattern_graph_rows).
                       super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
    ;
    pvVar8 = *(pointer *)
              &((_Var30._M_head_impl)->patterns_degrees).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ;
    pvVar9 = *(pointer *)((long)&(_Var30._M_head_impl)->patterns_degrees + 8);
    uVar34 = 0;
    do {
      lVar42 = (ulong)(this->max_graphs * (int)uVar34) * 0x88;
      uVar33 = (ulong)*(uint *)(lVar44 + 0x80 + lVar42);
      if (uVar33 < 0x11) {
        lVar42 = lVar42 + lVar44;
      }
      else {
        lVar42 = *(long *)(lVar44 + lVar42);
      }
      if (uVar33 == 0) {
        uVar65 = 0;
      }
      else {
        auVar60 = vpbroadcastq_avx512f();
        uVar41 = 0;
        auVar61 = ZEXT1664((undefined1  [16])0x0);
        do {
          auVar63 = auVar61;
          auVar61 = vpbroadcastq_avx512f();
          auVar61 = vporq_avx512f(auVar61,auVar59);
          uVar36 = vpcmpuq_avx512f(auVar61,auVar60,2);
          auVar61 = vmovdqu64_avx512f(*(undefined1 (*) [64])(lVar42 + uVar41 * 8));
          auVar62._8_8_ = (ulong)((byte)(uVar36 >> 1) & 1) * auVar61._8_8_;
          auVar62._0_8_ = (ulong)((byte)uVar36 & 1) * auVar61._0_8_;
          auVar62._16_8_ = (ulong)((byte)(uVar36 >> 2) & 1) * auVar61._16_8_;
          auVar62._24_8_ = (ulong)((byte)(uVar36 >> 3) & 1) * auVar61._24_8_;
          auVar62._32_8_ = (ulong)((byte)(uVar36 >> 4) & 1) * auVar61._32_8_;
          auVar62._40_8_ = (ulong)((byte)(uVar36 >> 5) & 1) * auVar61._40_8_;
          auVar62._48_8_ = (ulong)((byte)(uVar36 >> 6) & 1) * auVar61._48_8_;
          auVar62._56_8_ = (uVar36 >> 7) * auVar61._56_8_;
          uVar41 = uVar41 + 8;
          auVar61 = vpopcntq_avx512_vpopcntdq(auVar62);
          auVar54 = vpmovqd_avx512f(auVar61);
          auVar54 = vpaddd_avx2(auVar63._0_32_,auVar54);
          auVar61 = ZEXT3264(auVar54);
        } while ((uVar33 + 7 & 0x1fffffff8) != uVar41);
        auVar54 = vmovdqa32_avx512vl(auVar54);
        bVar19 = (bool)((byte)uVar36 & 1);
        auVar50._0_4_ = (uint)bVar19 * auVar54._0_4_ | (uint)!bVar19 * auVar63._0_4_;
        bVar19 = (bool)((byte)(uVar36 >> 1) & 1);
        auVar50._4_4_ = (uint)bVar19 * auVar54._4_4_ | (uint)!bVar19 * auVar63._4_4_;
        bVar19 = (bool)((byte)(uVar36 >> 2) & 1);
        auVar50._8_4_ = (uint)bVar19 * auVar54._8_4_ | (uint)!bVar19 * auVar63._8_4_;
        bVar19 = (bool)((byte)(uVar36 >> 3) & 1);
        auVar50._12_4_ = (uint)bVar19 * auVar54._12_4_ | (uint)!bVar19 * auVar63._12_4_;
        bVar19 = (bool)((byte)(uVar36 >> 4) & 1);
        auVar55._16_4_ = (uint)bVar19 * auVar54._16_4_ | (uint)!bVar19 * auVar63._16_4_;
        auVar55._0_16_ = auVar50;
        bVar19 = (bool)((byte)(uVar36 >> 5) & 1);
        auVar55._20_4_ = (uint)bVar19 * auVar54._20_4_ | (uint)!bVar19 * auVar63._20_4_;
        bVar19 = (bool)((byte)(uVar36 >> 6) & 1);
        auVar55._24_4_ = (uint)bVar19 * auVar54._24_4_ | (uint)!bVar19 * auVar63._24_4_;
        bVar19 = SUB81(uVar36 >> 7,0);
        auVar55._28_4_ = (uint)bVar19 * auVar54._28_4_ | (uint)!bVar19 * auVar63._28_4_;
        auVar50 = vphaddd_avx(auVar55._16_16_,auVar50);
        auVar50 = vphaddd_avx(auVar50,auVar50);
        auVar50 = vphaddd_avx(auVar50,auVar50);
        uVar65 = auVar50._0_4_;
      }
      if (pvVar9 == pvVar8) goto LAB_00128d21;
      uVar33 = (long)*(pointer *)((long)&pvVar8->super__Vector_base<int,_std::allocator<int>_> + 8)
               - *(long *)&pvVar8->super__Vector_base<int,_std::allocator<int>_> >> 2;
      if (uVar33 <= uVar34) goto LAB_00128d35;
      *(undefined4 *)(*(long *)&pvVar8->super__Vector_base<int,_std::allocator<int>_> + uVar34 * 4)
           = uVar65;
      uVar40 = (int)uVar34 + 1;
      uVar34 = (ulong)uVar40;
    } while (uVar40 < this->pattern_size);
  }
  if (this->target_size != 0) {
    auVar59 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    lVar44 = *(long *)&((_Var30._M_head_impl)->target_graph_rows).
                       super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
    ;
    pvVar8 = *(pointer *)
              &((_Var30._M_head_impl)->targets_degrees).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ;
    pvVar9 = *(pointer *)((long)&(_Var30._M_head_impl)->targets_degrees + 8);
    uVar34 = 0;
    do {
      lVar42 = (ulong)(this->max_graphs * (int)uVar34) * 0x88;
      uVar33 = (ulong)*(uint *)(lVar44 + 0x80 + lVar42);
      if (uVar33 < 0x11) {
        lVar42 = lVar42 + lVar44;
      }
      else {
        lVar42 = *(long *)(lVar44 + lVar42);
      }
      if (uVar33 == 0) {
        uVar65 = 0;
      }
      else {
        auVar60 = vpbroadcastq_avx512f();
        uVar41 = 0;
        auVar61 = ZEXT1664((undefined1  [16])0x0);
        do {
          auVar63 = auVar61;
          auVar61 = vpbroadcastq_avx512f();
          auVar61 = vporq_avx512f(auVar61,auVar59);
          uVar36 = vpcmpuq_avx512f(auVar61,auVar60,2);
          auVar62 = vmovdqu64_avx512f(*(undefined1 (*) [64])(lVar42 + uVar41 * 8));
          auVar61._8_8_ = (ulong)((byte)(uVar36 >> 1) & 1) * auVar62._8_8_;
          auVar61._0_8_ = (ulong)((byte)uVar36 & 1) * auVar62._0_8_;
          auVar61._16_8_ = (ulong)((byte)(uVar36 >> 2) & 1) * auVar62._16_8_;
          auVar61._24_8_ = (ulong)((byte)(uVar36 >> 3) & 1) * auVar62._24_8_;
          auVar61._32_8_ = (ulong)((byte)(uVar36 >> 4) & 1) * auVar62._32_8_;
          auVar61._40_8_ = (ulong)((byte)(uVar36 >> 5) & 1) * auVar62._40_8_;
          auVar61._48_8_ = (ulong)((byte)(uVar36 >> 6) & 1) * auVar62._48_8_;
          auVar61._56_8_ = (uVar36 >> 7) * auVar62._56_8_;
          uVar41 = uVar41 + 8;
          auVar61 = vpopcntq_avx512_vpopcntdq(auVar61);
          auVar54 = vpmovqd_avx512f(auVar61);
          auVar54 = vpaddd_avx2(auVar63._0_32_,auVar54);
          auVar61 = ZEXT3264(auVar54);
        } while ((uVar33 + 7 & 0x1fffffff8) != uVar41);
        auVar54 = vmovdqa32_avx512vl(auVar54);
        bVar19 = (bool)((byte)uVar36 & 1);
        auVar51._0_4_ = (uint)bVar19 * auVar54._0_4_ | (uint)!bVar19 * auVar63._0_4_;
        bVar19 = (bool)((byte)(uVar36 >> 1) & 1);
        auVar51._4_4_ = (uint)bVar19 * auVar54._4_4_ | (uint)!bVar19 * auVar63._4_4_;
        bVar19 = (bool)((byte)(uVar36 >> 2) & 1);
        auVar51._8_4_ = (uint)bVar19 * auVar54._8_4_ | (uint)!bVar19 * auVar63._8_4_;
        bVar19 = (bool)((byte)(uVar36 >> 3) & 1);
        auVar51._12_4_ = (uint)bVar19 * auVar54._12_4_ | (uint)!bVar19 * auVar63._12_4_;
        bVar19 = (bool)((byte)(uVar36 >> 4) & 1);
        auVar56._16_4_ = (uint)bVar19 * auVar54._16_4_ | (uint)!bVar19 * auVar63._16_4_;
        auVar56._0_16_ = auVar51;
        bVar19 = (bool)((byte)(uVar36 >> 5) & 1);
        auVar56._20_4_ = (uint)bVar19 * auVar54._20_4_ | (uint)!bVar19 * auVar63._20_4_;
        bVar19 = (bool)((byte)(uVar36 >> 6) & 1);
        auVar56._24_4_ = (uint)bVar19 * auVar54._24_4_ | (uint)!bVar19 * auVar63._24_4_;
        bVar19 = SUB81(uVar36 >> 7,0);
        auVar56._28_4_ = (uint)bVar19 * auVar54._28_4_ | (uint)!bVar19 * auVar63._28_4_;
        auVar50 = vphaddd_avx(auVar56._16_16_,auVar51);
        auVar50 = vphaddd_avx(auVar50,auVar50);
        auVar50 = vphaddd_avx(auVar50,auVar50);
        uVar65 = auVar50._0_4_;
      }
      if (pvVar9 == pvVar8) goto LAB_00128d21;
      uVar33 = (long)*(pointer *)((long)&pvVar8->super__Vector_base<int,_std::allocator<int>_> + 8)
               - *(long *)&pvVar8->super__Vector_base<int,_std::allocator<int>_> >> 2;
      if (uVar33 <= uVar34) goto LAB_00128d35;
      *(undefined4 *)(*(long *)&pvVar8->super__Vector_base<int,_std::allocator<int>_> + uVar34 * 4)
           = uVar65;
      uVar40 = (int)uVar34 + 1;
      uVar34 = (ulong)uVar40;
    } while (uVar40 < this->target_size);
  }
  bVar19 = global_degree_is_preserved((_Var30._M_head_impl)->params);
  if (bVar19) {
    p_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    t_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    np._data.short_data[0]._0_4_ = 0;
    p_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    p_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    t_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    t_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    if (this->pattern_size != 0) {
      uVar34 = 0;
      do {
        _Var30._M_head_impl =
             (this->_imp)._M_t.
             super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
        pvVar8 = *(pointer *)
                  &((_Var30._M_head_impl)->patterns_degrees).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ;
        if (*(pointer *)((long)&(_Var30._M_head_impl)->patterns_degrees + 8) == pvVar8) {
          uVar34 = 0;
          uVar33 = 0;
LAB_00128d43:
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar34,uVar33);
        }
        uVar33 = (long)*(pointer *)
                        ((long)&pvVar8->super__Vector_base<int,_std::allocator<int>_> + 8) -
                 *(long *)&pvVar8->super__Vector_base<int,_std::allocator<int>_> >> 2;
        if (uVar33 <= uVar34) goto LAB_00128d43;
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        emplace_back<unsigned_int&,int&>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&p_gds,
                   (uint *)&np,
                   (int *)(*(long *)&pvVar8->super__Vector_base<int,_std::allocator<int>_> +
                          uVar34 * 4));
        np._data.short_data[0]._0_4_ = np._data.short_data[0]._0_4_ + 1;
        uVar34 = (ulong)(uint)np._data.short_data[0]._0_4_;
      } while ((uint)np._data.short_data[0]._0_4_ < this->pattern_size);
    }
    np._data.short_data[0]._0_4_ = 0;
    if (this->target_size != 0) {
      do {
        _Var30._M_head_impl =
             (this->_imp)._M_t.
             super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
        pvVar8 = *(pointer *)
                  &((_Var30._M_head_impl)->targets_degrees).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ;
        if (*(pointer *)((long)&(_Var30._M_head_impl)->targets_degrees + 8) == pvVar8) {
          uVar33 = 0;
          uVar34 = 0;
LAB_00128d55:
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar33,uVar34);
        }
        uVar33 = (ulong)(uint)np._data.short_data[0]._0_4_;
        uVar34 = (long)*(pointer *)
                        ((long)&pvVar8->super__Vector_base<int,_std::allocator<int>_> + 8) -
                 *(long *)&pvVar8->super__Vector_base<int,_std::allocator<int>_> >> 2;
        if (uVar34 <= uVar33) goto LAB_00128d55;
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        emplace_back<unsigned_int&,int&>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&t_gds,
                   (uint *)&np,
                   (int *)(*(long *)&pvVar8->super__Vector_base<int,_std::allocator<int>_> +
                          uVar33 * 4));
        np._data.short_data[0]._0_4_ = np._data.short_data[0]._0_4_ + 1;
      } while ((uint)np._data.short_data[0]._0_4_ < this->target_size);
    }
    ppVar25 = p_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppVar17 = p_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (p_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
        .super__Vector_impl_data._M_start !=
        p_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
        .super__Vector_impl_data._M_finish) {
      lVar44 = (long)p_gds.
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)p_gds.
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<gss::innards::HomomorphismModel::prepare()::__0>>
                (p_gds.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 p_gds.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish,(int)LZCOUNT(lVar44 >> 3) * 2 ^ 0x7e);
      if (lVar44 < 0x81) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<gss::innards::HomomorphismModel::prepare()::__0>>
                  (ppVar25,ppVar17);
      }
      else {
        ppVar45 = ppVar25 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<gss::innards::HomomorphismModel::prepare()::__0>>
                  (ppVar25,ppVar45);
        if (ppVar45 != ppVar17) {
          piVar49 = &ppVar25[0x10].second;
          do {
            pVar10 = *ppVar45;
            iVar28 = ppVar45[-1].second;
            iVar38 = pVar10.second;
            ppVar25 = ppVar45;
            piVar18 = piVar49;
            if (iVar28 < iVar38) {
              do {
                piVar35 = piVar18;
                iVar29 = piVar35[-4];
                ((pair<int,_int> *)(piVar35 + -1))->first = piVar35[-3];
                *piVar35 = iVar28;
                piVar18 = piVar35 + -2;
                iVar28 = iVar29;
              } while (iVar29 < iVar38);
              ppVar25 = (pointer)(piVar35 + -3);
            }
            ppVar45 = ppVar45 + 1;
            piVar49 = piVar49 + 2;
            ppVar25->first = pVar10.first;
            ppVar25->second = iVar38;
          } while (ppVar45 != ppVar17);
        }
      }
    }
    ppVar25 = t_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppVar17 = t_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (t_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
        .super__Vector_impl_data._M_start !=
        t_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
        .super__Vector_impl_data._M_finish) {
      lVar44 = (long)t_gds.
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)t_gds.
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<gss::innards::HomomorphismModel::prepare()::__1>>
                (t_gds.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 t_gds.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish,(int)LZCOUNT(lVar44 >> 3) * 2 ^ 0x7e);
      if (lVar44 < 0x81) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<gss::innards::HomomorphismModel::prepare()::__1>>
                  (ppVar25,ppVar17);
      }
      else {
        ppVar45 = ppVar25 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<gss::innards::HomomorphismModel::prepare()::__1>>
                  (ppVar25,ppVar45);
        if (ppVar45 != ppVar17) {
          piVar49 = &ppVar25[0x10].second;
          do {
            pVar10 = *ppVar45;
            iVar28 = ppVar45[-1].second;
            iVar38 = pVar10.second;
            ppVar25 = ppVar45;
            piVar18 = piVar49;
            if (iVar28 < iVar38) {
              do {
                piVar35 = piVar18;
                iVar29 = piVar35[-4];
                ((pair<int,_int> *)(piVar35 + -1))->first = piVar35[-3];
                *piVar35 = iVar28;
                piVar18 = piVar35 + -2;
                iVar28 = iVar29;
              } while (iVar29 < iVar38);
              ppVar25 = (pointer)(piVar35 + -3);
            }
            ppVar45 = ppVar45 + 1;
            piVar49 = piVar49 + 2;
            ppVar25->first = pVar10.first;
            ppVar25->second = iVar38;
          } while (ppVar45 != ppVar17);
        }
      }
    }
    lVar44 = (long)p_gds.
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)p_gds.
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    uVar34 = CONCAT71((int7)((ulong)this >> 8),lVar44 != 0);
    if (lVar44 == 0) {
LAB_001268a8:
      cVar37 = (char)uVar34;
      ppVar25 = t_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (t_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) goto LAB_001268b2;
    }
    else {
      uVar33 = 0;
      do {
        if ((ulong)((long)t_gds.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)t_gds.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar33) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar33);
        }
        ppVar25 = t_gds.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (t_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar33].second <
            p_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar33].second) {
          if (*(long *)&(((this->_imp)._M_t.
                          super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                          .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                         _M_head_impl)->proof).
                        super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2> != 0) {
            local_450 = (long *)CONCAT44(local_450._4_4_,(int)uVar34);
            uVar40 = 0;
            local_4c8 = uVar33;
            local_4c0 = uVar33;
            do {
              n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage = (pointer)0x0;
              uVar34 = (ulong)uVar40;
              n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start = (pointer)0x0;
              n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish = (pointer)0x0;
              if ((ulong)((long)p_gds.
                                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)p_gds.
                                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar34) {
                std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar34);
              }
              SVOBitset::SVOBitset
                        (&np,(SVOBitset *)
                             ((ulong)(this->max_graphs *
                                     p_gds.
                                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar34].first) * 0x88
                             + *(long *)&(((this->_imp)._M_t.
                                           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                           .
                                           super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                          ._M_head_impl)->pattern_graph_rows).
                                         super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                             ));
              uVar32 = this->pattern_size;
              if (uVar32 != 0) {
                uVar41 = 0;
                do {
                  pSVar22 = &np;
                  if (0x10 < np.n_words) {
                    pSVar22 = (SVOBitset *)
                              CONCAT44(np._data.short_data[0]._4_4_,np._data.short_data[0]._0_4_);
                  }
                  iVar28 = (int)uVar41;
                  iVar38 = iVar28 + 0x3f;
                  if (-1 < iVar28) {
                    iVar38 = iVar28;
                  }
                  if (((pSVar22->_data).short_data[iVar38 >> 6] >> (uVar41 & 0x3f) & 1) != 0) {
                    patterns.
                    super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start._0_4_ = iVar28;
                    if (n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish ==
                        n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                (&n_p,(iterator)
                                      n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_finish,(int *)&patterns);
                    }
                    else {
                      *n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish = iVar28;
                      n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish =
                           n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1;
                    }
                    uVar32 = this->pattern_size;
                  }
                  uVar41 = (ulong)(iVar28 + 1U);
                } while (iVar28 + 1U < uVar32);
              }
              uVar33 = uVar33 & 0xffffffff;
              uVar41 = local_4c0;
              if (local_4c0 <
                  (ulong)((long)t_gds.
                                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)t_gds.
                                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3)) {
                do {
                  n_t.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage = (pointer)0x0;
                  n_t.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start = (pointer)0x0;
                  n_t.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_finish = (pointer)0x0;
                  SVOBitset::SVOBitset
                            ((SVOBitset *)&patterns,
                             (SVOBitset *)
                             ((ulong)(this->max_graphs *
                                     t_gds.
                                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar41].first) * 0x88
                             + *(long *)&(((this->_imp)._M_t.
                                           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                           .
                                           super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                          ._M_head_impl)->target_graph_rows).
                                         super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                             ));
                  uVar36 = (ulong)local_148;
                  pSVar22 = (SVOBitset *)&patterns;
                  if (0x10 < uVar36) {
                    pSVar22 = (SVOBitset *)
                              patterns.
                              super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                  }
                  if (uVar36 != 0) {
                    iVar28 = 0;
                    uVar39 = 0;
LAB_001264eb:
                    BVar11 = (pSVar22->_data).short_data[uVar39];
                    if (BVar11 == 0) goto code_r0x001264f4;
                    iVar38 = 0;
                    for (; (BVar11 & 1) == 0; BVar11 = BVar11 >> 1 | 0x8000000000000000) {
                      iVar38 = iVar38 + 1;
                    }
                    if (iVar38 + 1 == iVar28) goto LAB_00126511;
                    iVar38 = iVar38 - iVar28;
                    while( true ) {
                      pSVar22 = (SVOBitset *)
                                patterns.
                                super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      if ((uint)uVar36 < 0x11) {
                        pSVar22 = (SVOBitset *)&patterns;
                      }
                      bVar14 = (byte)iVar38 & 0x3f;
                      iVar28 = iVar38 + 0x3f;
                      if (-1 < iVar38) {
                        iVar28 = iVar38;
                      }
                      (pSVar22->_data).short_data[iVar28 >> 6] =
                           (pSVar22->_data).short_data[iVar28 >> 6] &
                           (-2L << bVar14 | 0xfffffffffffffffeU >> 0x40 - bVar14);
                      targets.
                      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._0_4_ = iVar38;
                      if (n_t.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish ==
                          n_t.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage) {
                        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                  (&n_t,(iterator)
                                        n_t.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_finish,(int *)&targets);
                      }
                      else {
                        *n_t.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish = iVar38;
                        n_t.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish =
                             n_t.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish + 1;
                      }
                      uVar36 = (ulong)local_148;
                      pSVar22 = (SVOBitset *)&patterns;
                      if (0x10 < uVar36) {
                        pSVar22 = (SVOBitset *)
                                  patterns.
                                  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
                      }
                      if (uVar36 == 0) break;
                      iVar28 = 0;
                      uVar39 = 0;
                      while (BVar11 = (pSVar22->_data).short_data[uVar39], BVar11 == 0) {
                        uVar39 = uVar39 + 1;
                        iVar28 = iVar28 + -0x40;
                        if (uVar36 == uVar39) goto LAB_00126511;
                      }
                      iVar29 = 0;
                      for (; (BVar11 & 1) == 0; BVar11 = BVar11 >> 1 | 0x8000000000000000) {
                        iVar29 = iVar29 + 1;
                      }
                      iVar38 = iVar29 - iVar28;
                      if (iVar29 + 1 == iVar28) break;
                    }
                  }
LAB_00126511:
                  if ((ulong)((long)p_gds.
                                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)p_gds.
                                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar34) {
                    std::__throw_out_of_range_fmt
                              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                               ,uVar34);
                  }
                  pPVar12 = (((this->_imp)._M_t.
                              super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                              .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                             _M_head_impl)->proof).
                            super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr;
                  pattern_vertex_for_proof_abi_cxx11_
                            ((NamedVertex *)&targets,this,
                             p_gds.
                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar34].first);
                  if ((ulong)((long)t_gds.
                                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)t_gds.
                                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar41) {
                    std::__throw_out_of_range_fmt
                              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                               ,uVar41);
                  }
                  target_vertex_for_proof_abi_cxx11_
                            ((NamedVertex *)&n2_t,this,
                             t_gds.
                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar41].first);
                  Proof::incompatible_by_degrees
                            (pPVar12,0,(NamedVertex *)&targets,&n_p,(NamedVertex *)&n2_t,&n_t);
                  if ((undefined1 *)n2_t._data.short_data[1] !=
                      (undefined1 *)((long)&n2_t._data + 0x18)) {
                    operator_delete((void *)n2_t._data.short_data[1],n2_t._data.short_data[3] + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)targets.
                         super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish != aaStack_340) {
                    operator_delete(targets.
                                    super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish,
                                    aaStack_340[0]._M_allocated_capacity + 1);
                  }
                  if ((0x10 < local_148) &&
                     (patterns.
                      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
                    operator_delete__(patterns.
                                      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
                  }
                  if (n_t.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(n_t.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start,
                                    (long)n_t.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_end_of_storage -
                                    (long)n_t.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start);
                  }
                  uVar33 = (ulong)((int)uVar33 + 1);
                  uVar41 = uVar33;
                } while (uVar33 < (ulong)((long)t_gds.
                                                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)t_gds.
                                                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start >> 3));
              }
              if ((0x10 < np.n_words) &&
                 ((void *)CONCAT44(np._data.short_data[0]._4_4_,np._data.short_data[0]._0_4_) !=
                  (void *)0x0)) {
                operator_delete__((void *)CONCAT44(np._data.short_data[0]._4_4_,
                                                   np._data.short_data[0]._0_4_));
              }
              uVar33 = local_4c8;
              if (n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start != (pointer)0x0) {
                operator_delete(n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage -
                                (long)n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start);
              }
              uVar40 = uVar40 + 1;
            } while (uVar40 <= (uint)uVar33);
            puVar6 = (undefined1 *)((long)&np._data + 0x18);
            uVar34 = 0;
            targets.
            super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            patterns.
            super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            patterns.
            super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            patterns.
            super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            _targets = ZEXT4864(stack0xfffffffffffffcb8) << 0x80;
            do {
              if ((ulong)((long)p_gds.
                                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)p_gds.
                                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar34) {
                std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar34);
              }
              pattern_vertex_for_proof_abi_cxx11_
                        ((NamedVertex *)&np,this,
                         p_gds.
                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar34].first);
              std::
              vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
              ::emplace_back<std::pair<int,std::__cxx11::string>>
                        ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                          *)&patterns,
                         (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&np);
              if ((undefined1 *)np._data.short_data[1] != puVar6) {
                operator_delete((void *)np._data.short_data[1],np._data.short_data[3] + 1);
              }
              uVar40 = (int)uVar34 + 1;
              uVar34 = (ulong)uVar40;
            } while (uVar40 <= (uint)local_4c8);
            if ((uint)local_4c8 != 0) {
              uVar34 = 0;
              do {
                if ((ulong)((long)t_gds.
                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)t_gds.
                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar34) {
                  std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,uVar34);
                }
                target_vertex_for_proof_abi_cxx11_
                          ((NamedVertex *)&np,this,
                           t_gds.
                           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar34].first);
                std::
                vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                ::emplace_back<std::pair<int,std::__cxx11::string>>
                          ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                            *)&targets,
                           (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&np);
                if ((undefined1 *)np._data.short_data[1] != puVar6) {
                  operator_delete((void *)np._data.short_data[1],np._data.short_data[3] + 1);
                }
                uVar34 = uVar34 + 1;
              } while (local_4c0 != uVar34);
            }
            Proof::emit_hall_set_or_violator
                      ((((this->_imp)._M_t.
                         super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                         .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                        _M_head_impl)->proof).
                       super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       &patterns,&targets);
            std::
            vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~vector(&targets);
            std::
            vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~vector(&patterns);
            uVar34 = (ulong)local_450 & 0xffffffff;
            goto LAB_001268a8;
          }
          cVar37 = '\x01';
          goto LAB_001268b2;
        }
        uVar33 = (ulong)((int)uVar33 + 1);
      } while (uVar33 < (ulong)(lVar44 >> 3));
      cVar37 = '\0';
LAB_001268b2:
      operator_delete(ppVar25,(long)t_gds.
                                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)ppVar25);
    }
    if (p_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
        .super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(p_gds.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)p_gds.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)p_gds.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (cVar37 != '\0') {
      return false;
    }
  }
  next_pattern_supplemental = 1;
  next_target_supplemental = 1;
  bVar19 = supports_exact_path_graphs
                     (((this->_imp)._M_t.
                       super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                       .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                      _M_head_impl)->params);
  _Var30._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
       .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
  if (bVar19) {
    _build_exact_path_graphs
              (this,&(_Var30._M_head_impl)->pattern_graph_rows,this->pattern_size,
               &next_pattern_supplemental,*(uint *)((long)(_Var30._M_head_impl)->params + 0x68),
               (_Var30._M_head_impl)->directed,false,true);
    _Var30._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
    _build_exact_path_graphs
              (this,&(_Var30._M_head_impl)->target_graph_rows,this->target_size,
               &next_target_supplemental,*(uint *)((long)(_Var30._M_head_impl)->params + 0x68),
               (_Var30._M_head_impl)->directed,false,false);
    _Var30._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
    if ((((_Var30._M_head_impl)->proof).
         super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
         (element_type *)0x0) &&
       (lVar44 = (long)(_Var30._M_head_impl)->params, 0 < *(int *)(lVar44 + 0x68))) {
      uVar40 = this->pattern_size;
      uVar34 = 1;
      uVar32 = uVar40;
      do {
        if (uVar32 == 0) {
          uVar32 = 0;
        }
        else {
          uVar32 = 0;
          do {
            if (uVar40 != 0) {
              uVar33 = 0;
              local_4c0 = CONCAT44(local_4c0._4_4_,uVar32);
              do {
                uVar47 = (uint)uVar33;
                if (uVar32 != uVar47) {
                  lVar44 = *(long *)&(((this->_imp)._M_t.
                                       super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                       .
                                       super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                      ._M_head_impl)->pattern_graph_rows).
                                     super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                  ;
                  iVar28 = (int)uVar34;
                  lVar42 = (ulong)(this->max_graphs * uVar32 + iVar28) * 0x88;
                  if (*(uint *)(lVar44 + 0x80 + lVar42) < 0x11) {
                    lVar44 = lVar44 + lVar42;
                  }
                  else {
                    lVar44 = *(long *)(lVar44 + lVar42);
                  }
                  uVar20 = uVar47 + 0x3f;
                  if (-1 < (int)uVar47) {
                    uVar20 = uVar47;
                  }
                  if ((*(ulong *)(lVar44 + (long)((int)uVar20 >> 6) * 8) >> (uVar33 & 0x3f) & 1) !=
                      0) {
                    pattern_vertex_for_proof_abi_cxx11_((NamedVertex *)&t_gds,this,uVar32);
                    local_4c8 = uVar33;
                    pattern_vertex_for_proof_abi_cxx11_((NamedVertex *)&n_p,this,uVar47);
                    SVOBitset::SVOBitset
                              (&np,(SVOBitset *)
                                   ((ulong)(this->max_graphs * uVar32) * 0x88 +
                                   *(long *)&(((this->_imp)._M_t.
                                               super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                               .
                                               super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                              ._M_head_impl)->pattern_graph_rows).
                                             super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                                   ));
                    SVOBitset::operator&=
                              (&np,(SVOBitset *)
                                   ((ulong)(this->max_graphs * (uint)local_4c8) * 0x88 +
                                   *(long *)&(((this->_imp)._M_t.
                                               super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                               .
                                               super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                              ._M_head_impl)->pattern_graph_rows).
                                             super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                                   ));
                    uVar33 = (ulong)np.n_words;
                    between_p_and_q.
                    super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    between_p_and_q.
                    super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                    between_p_and_q.
                    super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    uVar24 = &np;
                    if (0x10 < uVar33) {
                      uVar24 = np._data.short_data[0];
                    }
                    if (uVar33 != 0) {
                      iVar38 = 0;
                      uVar41 = 0;
LAB_00126ad8:
                      BVar11 = (((SVOBitset *)uVar24)->_data).short_data[uVar41];
                      if (BVar11 == 0) goto code_r0x00126ae1;
                      iVar29 = 0;
                      for (; (BVar11 & 1) == 0; BVar11 = BVar11 >> 1 | 0x8000000000000000) {
                        iVar29 = iVar29 + 1;
                      }
                      if (iVar29 + 1 == iVar38) goto LAB_00126afe;
                      iVar29 = iVar29 - iVar38;
                      while( true ) {
                        pvVar26 = (value_type *)np._data.short_data[0];
                        if ((uint)uVar33 < 0x11) {
                          pvVar26 = &np;
                        }
                        bVar14 = (byte)iVar29 & 0x3f;
                        iVar38 = iVar29 + 0x3f;
                        if (-1 < iVar29) {
                          iVar38 = iVar29;
                        }
                        (pvVar26->_data).short_data[iVar38 >> 6] =
                             (pvVar26->_data).short_data[iVar38 >> 6] &
                             (-2L << bVar14 | 0xfffffffffffffffeU >> 0x40 - bVar14);
                        pattern_vertex_for_proof_abi_cxx11_((NamedVertex *)&patterns,this,iVar29);
                        std::
                        vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                        ::emplace_back<std::pair<int,std::__cxx11::string>>
                                  ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                                    *)&between_p_and_q,(NamedVertex *)&patterns);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)patterns.
                               super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish != aaStack_1b0) {
                          operator_delete(patterns.
                                          super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish,
                                          aaStack_1b0[0]._M_allocated_capacity + 1);
                        }
                        if (uVar34 <= (ulong)(((long)between_p_and_q.
                                                                                                          
                                                  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                               (long)between_p_and_q.
                                                                                                          
                                                  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                             -0x3333333333333333)) break;
                        uVar33 = (ulong)np.n_words;
                        pvVar26 = &np;
                        if (0x10 < uVar33) {
                          pvVar26 = (value_type *)np._data.short_data[0];
                        }
                        if (uVar33 == 0) break;
                        iVar38 = 0;
                        uVar41 = 0;
                        while (uVar36 = (pvVar26->_data).short_data[uVar41], uVar36 == 0) {
                          uVar41 = uVar41 + 1;
                          iVar38 = iVar38 + -0x40;
                          if (uVar33 == uVar41) goto LAB_00126afe;
                        }
                        iVar43 = 0;
                        for (; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
                          iVar43 = iVar43 + 1;
                        }
                        iVar29 = iVar43 - iVar38;
                        if (iVar43 + 1 == iVar38) break;
                      }
                    }
LAB_00126afe:
                    if (this->target_size != 0) {
                      uVar40 = 0;
                      do {
                        target_vertex_for_proof_abi_cxx11_((NamedVertex *)&n_t,this,uVar40);
                        named_n_t.
                        super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                        named_d_n_t.
                        super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                        named_two_away_from_t.
                        super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                        named_n_t.
                        super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                        named_n_t.
                        super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                        named_d_n_t.
                        super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                        named_d_n_t.
                        super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                        named_two_away_from_t.
                        super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                        named_two_away_from_t.
                        super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                        SVOBitset::SVOBitset
                                  ((SVOBitset *)&patterns,
                                   (SVOBitset *)
                                   ((ulong)(this->max_graphs * uVar40) * 0x88 +
                                   *(long *)&(((this->_imp)._M_t.
                                               super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                               .
                                               super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                              ._M_head_impl)->target_graph_rows).
                                             super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                                   ));
                        uVar33 = (ulong)local_148;
                        pSVar22 = (SVOBitset *)&patterns;
                        if (0x10 < uVar33) {
                          pSVar22 = (SVOBitset *)
                                    patterns.
                                    super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                        }
                        if (uVar33 != 0) {
                          iVar38 = 0;
                          uVar41 = 0;
LAB_00126b9d:
                          uVar36 = (pSVar22->_data).short_data[uVar41];
                          if (uVar36 == 0) goto code_r0x00126ba6;
                          iVar29 = 0;
                          for (; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
                            iVar29 = iVar29 + 1;
                          }
                          if (iVar29 + 1 == iVar38) goto LAB_00126bc3;
                          iVar29 = iVar29 - iVar38;
                          while( true ) {
                            pSVar22 = (SVOBitset *)
                                      patterns.
                                      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start;
                            if ((uint)uVar33 < 0x11) {
                              pSVar22 = (SVOBitset *)&patterns;
                            }
                            bVar14 = (byte)iVar29 & 0x3f;
                            iVar38 = iVar29 + 0x3f;
                            if (-1 < iVar29) {
                              iVar38 = iVar29;
                            }
                            (pSVar22->_data).short_data[iVar38 >> 6] =
                                 (pSVar22->_data).short_data[iVar38 >> 6] &
                                 (-2L << bVar14 | 0xfffffffffffffffeU >> 0x40 - bVar14);
                            target_vertex_for_proof_abi_cxx11_((NamedVertex *)&targets,this,iVar29);
                            std::
                            vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                            ::emplace_back<std::pair<int,std::__cxx11::string>>
                                      ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                                        *)&named_n_t,(NamedVertex *)&targets);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)targets.
                                   super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish != aaStack_340) {
                              operator_delete(targets.
                                              super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish,
                                              aaStack_340[0]._M_allocated_capacity + 1);
                            }
                            uVar33 = (ulong)local_148;
                            pSVar22 = (SVOBitset *)&patterns;
                            if (0x10 < uVar33) {
                              pSVar22 = (SVOBitset *)
                                        patterns.
                                        super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start;
                            }
                            if (uVar33 == 0) break;
                            iVar38 = 0;
                            uVar41 = 0;
                            while (uVar36 = (pSVar22->_data).short_data[uVar41], uVar36 == 0) {
                              uVar41 = uVar41 + 1;
                              iVar38 = iVar38 + -0x40;
                              if (uVar33 == uVar41) goto LAB_00126bc3;
                            }
                            iVar43 = 0;
                            for (; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
                              iVar43 = iVar43 + 1;
                            }
                            iVar29 = iVar43 - iVar38;
                            if (iVar43 + 1 == iVar38) break;
                          }
                        }
LAB_00126bc3:
                        SVOBitset::SVOBitset
                                  ((SVOBitset *)&targets,
                                   (SVOBitset *)
                                   ((ulong)(this->max_graphs * uVar40 + iVar28) * 0x88 +
                                   *(long *)&(((this->_imp)._M_t.
                                               super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                               .
                                               super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                              ._M_head_impl)->target_graph_rows).
                                             super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                                   ));
                        uVar33 = (ulong)local_2d8;
                        pSVar22 = (SVOBitset *)&targets;
                        if (0x10 < uVar33) {
                          pSVar22 = (SVOBitset *)
                                    targets.
                                    super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                        }
                        if (uVar33 != 0) {
                          iVar38 = 0;
                          uVar41 = 0;
LAB_00126c1b:
                          BVar11 = (pSVar22->_data).short_data[uVar41];
                          if (BVar11 == 0) goto code_r0x00126c24;
                          iVar29 = 0;
                          for (; (BVar11 & 1) == 0; BVar11 = BVar11 >> 1 | 0x8000000000000000) {
                            iVar29 = iVar29 + 1;
                          }
                          if (iVar29 + 1 == iVar38) goto LAB_00126c43;
                          iVar29 = iVar29 - iVar38;
                          while( true ) {
                            ppVar23 = targets.
                                      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start;
                            if ((uint)uVar33 < 0x11) {
                              ppVar23 = (pointer)&targets;
                            }
                            bVar14 = (byte)iVar29 & 0x3f;
                            iVar38 = iVar29 + 0x3f;
                            if (-1 < iVar29) {
                              iVar38 = iVar29;
                            }
                            pppVar2 = &(((_Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                          *)&ppVar23->first)->_M_impl).super__Vector_impl_data.
                                       _M_start + (iVar38 >> 6);
                            *pppVar2 = (pointer)((ulong)*pppVar2 &
                                                (-2L << bVar14 |
                                                0xfffffffffffffffeU >> 0x40 - bVar14));
                            target_vertex_for_proof_abi_cxx11_((NamedVertex *)&n2_t,this,iVar29);
                            std::
                            vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                            ::emplace_back<std::pair<int,std::__cxx11::string>>
                                      ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                                        *)&named_d_n_t,
                                       (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&n2_t);
                            if ((undefined1 *)n2_t._data.short_data[1] !=
                                (undefined1 *)((long)&n2_t._data + 0x18)) {
                              operator_delete((void *)n2_t._data.short_data[1],
                                              n2_t._data.short_data[3] + 1);
                            }
                            uVar33 = (ulong)local_2d8;
                            ppVar23 = (pointer)&targets;
                            if (0x10 < uVar33) {
                              ppVar23 = targets.
                                        super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start;
                            }
                            if (uVar33 == 0) break;
                            iVar38 = 0;
                            uVar41 = 0;
                            while (ppVar13 = (&(((_Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)&ppVar23->first)->_M_impl).
                                               super__Vector_impl_data._M_start)[uVar41],
                                  ppVar13 == (pointer)0x0) {
                              uVar41 = uVar41 + 1;
                              iVar38 = iVar38 + -0x40;
                              if (uVar33 == uVar41) goto LAB_00126c43;
                            }
                            iVar43 = 0;
                            for (; ((ulong)ppVar13 & 1) == 0;
                                ppVar13 = (pointer)((ulong)ppVar13 >> 1 | 0x8000000000000000)) {
                              iVar43 = iVar43 + 1;
                            }
                            iVar29 = iVar43 - iVar38;
                            if (iVar43 + 1 == iVar38) break;
                          }
                        }
LAB_00126c43:
                        SVOBitset::SVOBitset
                                  (&n2_t,(SVOBitset *)
                                         ((ulong)(this->max_graphs * uVar40 + 1) * 0x88 +
                                         *(long *)&(((this->_imp)._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                  .
                                                  super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                                  ._M_head_impl)->target_graph_rows).
                                                  super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                                         ));
                        uVar33 = (ulong)n2_t.n_words;
                        uVar24 = &n2_t;
                        if (0x10 < uVar33) {
                          uVar24 = n2_t._data.short_data[0];
                        }
                        if (uVar33 != 0) {
                          iVar38 = 0;
                          uVar41 = 0;
LAB_00126c8f:
                          uVar36 = (((SVOBitset *)uVar24)->_data).short_data[uVar41];
                          if (uVar36 == 0) goto code_r0x00126c98;
                          iVar29 = 0;
                          for (; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
                            iVar29 = iVar29 + 1;
                          }
                          if (iVar29 + 1 != iVar38) {
                            iVar29 = iVar29 - iVar38;
                            do {
                              uVar24 = n2_t._data.short_data[0];
                              if ((uint)uVar33 < 0x11) {
                                uVar24 = &n2_t;
                              }
                              bVar14 = (byte)iVar29 & 0x3f;
                              iVar38 = iVar29 + 0x3f;
                              if (-1 < iVar29) {
                                iVar38 = iVar29;
                              }
                              (((value_type *)uVar24)->_data).short_data[iVar38 >> 6] =
                                   (((value_type *)uVar24)->_data).short_data[iVar38 >> 6] &
                                   (-2L << bVar14 | 0xfffffffffffffffeU >> 0x40 - bVar14);
                              SVOBitset::SVOBitset
                                        ((SVOBitset *)&p_gds,
                                         (SVOBitset *)
                                         ((ulong)(this->max_graphs * iVar29) * 0x88 +
                                         *(long *)&(((this->_imp)._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                  .
                                                  super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                                  ._M_head_impl)->target_graph_rows).
                                                  super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                                         ));
                              SVOBitset::operator&=
                                        ((SVOBitset *)&p_gds,
                                         (SVOBitset *)
                                         ((ulong)(this->max_graphs * uVar40) * 0x88 +
                                         *(long *)&(((this->_imp)._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                  .
                                                  super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                                  ._M_head_impl)->target_graph_rows).
                                                  super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                                         ));
                              uVar33 = (ulong)local_88;
                              named_n_t_w.
                              super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                              named_n_t_w.
                              super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                              named_n_t_w.
                              super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                              pSVar22 = (SVOBitset *)&p_gds;
                              if (0x10 < uVar33) {
                                pSVar22 = (SVOBitset *)
                                          p_gds.
                                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start;
                              }
                              if (uVar33 != 0) {
                                iVar38 = 0;
                                uVar41 = 0;
LAB_00127012:
                                BVar11 = (pSVar22->_data).short_data[uVar41];
                                if (BVar11 == 0) goto code_r0x0012701b;
                                iVar43 = 0;
                                for (; (BVar11 & 1) == 0; BVar11 = BVar11 >> 1 | 0x8000000000000000)
                                {
                                  iVar43 = iVar43 + 1;
                                }
                                if (iVar43 + 1 == iVar38) goto LAB_0012703a;
                                iVar43 = iVar43 - iVar38;
                                while( true ) {
                                  ppVar25 = p_gds.
                                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start;
                                  if ((uint)uVar33 < 0x11) {
                                    ppVar25 = (pointer)&p_gds;
                                  }
                                  bVar14 = (byte)iVar43 & 0x3f;
                                  iVar38 = iVar43 + 0x3f;
                                  if (-1 < iVar43) {
                                    iVar38 = iVar43;
                                  }
                                  ppVar25[iVar38 >> 6] =
                                       (pair<int,_int>)
                                       ((ulong)ppVar25[iVar38 >> 6] &
                                       (-2L << bVar14 | 0xfffffffffffffffeU >> 0x40 - bVar14));
                                  target_vertex_for_proof_abi_cxx11_(&named_p_1,this,iVar43);
                                  std::
                                  vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                                  ::emplace_back<std::pair<int,std::__cxx11::string>>
                                            ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                                              *)&named_n_t_w,&named_p_1);
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)named_p_1.second._M_dataplus._M_p !=
                                      &named_p_1.second.field_2) {
                                    operator_delete(named_p_1.second._M_dataplus._M_p,
                                                    named_p_1.second.field_2._M_allocated_capacity +
                                                    1);
                                  }
                                  uVar33 = (ulong)local_88;
                                  ppVar25 = (pointer)&p_gds;
                                  if (0x10 < uVar33) {
                                    ppVar25 = p_gds.
                                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start;
                                  }
                                  if (uVar33 == 0) break;
                                  iVar38 = 0;
                                  uVar41 = 0;
                                  while (pVar10 = ppVar25[uVar41], pVar10 == (pair<int,_int>)0x0) {
                                    uVar41 = uVar41 + 1;
                                    iVar38 = iVar38 + -0x40;
                                    if (uVar33 == uVar41) goto LAB_0012703a;
                                  }
                                  iVar16 = 0;
                                  for (; ((ulong)pVar10 & 1) == 0;
                                      pVar10 = (pair<int,_int>)
                                               ((ulong)pVar10 >> 1 | 0x8000000000000000)) {
                                    iVar16 = iVar16 + 1;
                                  }
                                  iVar43 = iVar16 - iVar38;
                                  if (iVar16 + 1 == iVar38) break;
                                }
                              }
LAB_0012703a:
                              target_vertex_for_proof_abi_cxx11_(&named_p_1,this,iVar29);
                              std::
                              vector<std::pair<std::pair<int,std::__cxx11::string>,std::vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>>,std::allocator<std::pair<std::pair<int,std::__cxx11::string>,std::vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>>>>
                              ::
                              emplace_back<std::pair<int,std::__cxx11::string>,std::vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>&>
                                        ((vector<std::pair<std::pair<int,std::__cxx11::string>,std::vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>>,std::allocator<std::pair<std::pair<int,std::__cxx11::string>,std::vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>>>>
                                          *)&named_two_away_from_t,&named_p_1,&named_n_t_w);
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)named_p_1.second._M_dataplus._M_p != &named_p_1.second.field_2)
                              {
                                operator_delete(named_p_1.second._M_dataplus._M_p,
                                                named_p_1.second.field_2._M_allocated_capacity + 1);
                              }
                              std::
                              vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ::~vector(&named_n_t_w);
                              if ((0x10 < local_88) &&
                                 (p_gds.
                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
                                operator_delete__(p_gds.
                                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                              }
                              uVar33 = (ulong)n2_t.n_words;
                              uVar24 = &n2_t;
                              if (0x10 < uVar33) {
                                uVar24 = n2_t._data.short_data[0];
                              }
                              if (uVar33 == 0) break;
                              iVar38 = 0;
                              uVar41 = 0;
                              while (uVar36 = (((value_type *)uVar24)->_data).short_data[uVar41],
                                    uVar36 == 0) {
                                uVar41 = uVar41 + 1;
                                iVar38 = iVar38 + -0x40;
                                if (uVar33 == uVar41) goto LAB_00126cb6;
                              }
                              iVar43 = 0;
                              for (; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
                                iVar43 = iVar43 + 1;
                              }
                              iVar29 = iVar43 - iVar38;
                              if (iVar43 + 1 == iVar38) break;
                            } while( true );
                          }
                        }
LAB_00126cb6:
                        Proof::create_exact_path_graphs
                                  ((((this->_imp)._M_t.
                                     super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                     .
                                     super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                    ._M_head_impl)->proof).
                                   super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr,iVar28,(NamedVertex *)&t_gds,(NamedVertex *)&n_p,
                                   &between_p_and_q,(NamedVertex *)&n_t,&named_n_t,
                                   &named_two_away_from_t,&named_d_n_t);
                        if ((0x10 < n2_t.n_words) && (n2_t._data.short_data[0] != 0)) {
                          operator_delete__(n2_t._data.long_data);
                        }
                        if ((0x10 < local_2d8) &&
                           (targets.
                            super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
                          operator_delete__(targets.
                                            super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                        }
                        if ((0x10 < local_148) &&
                           (patterns.
                            super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
                          operator_delete__(patterns.
                                            super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                        }
                        std::
                        vector<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                        ::~vector(&named_two_away_from_t);
                        std::
                        vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::~vector(&named_d_n_t);
                        std::
                        vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::~vector(&named_n_t);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)n_t.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish != &local_430) {
                          operator_delete(n_t.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_finish,
                                          (ulong)(local_430._0_8_ + 1));
                        }
                        uVar40 = uVar40 + 1;
                      } while (uVar40 < this->target_size);
                    }
                    std::
                    vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::~vector(&between_p_and_q);
                    if ((0x10 < np.n_words) && (np._data.short_data[0] != 0)) {
                      operator_delete__(np._data.long_data);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish != &aStack_470) {
                      operator_delete(n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_finish,
                                      (ulong)(aStack_470._M_allocated_capacity + 1));
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)t_gds.
                           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish != &aStack_4a0) {
                      operator_delete(t_gds.
                                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish,
                                      aStack_4a0._M_allocated_capacity + 1);
                    }
                    uVar40 = this->pattern_size;
                    uVar33 = local_4c8;
                    uVar32 = (uint)local_4c0;
                  }
                }
                uVar47 = (int)uVar33 + 1;
                uVar33 = (ulong)uVar47;
              } while (uVar47 < uVar40);
            }
            uVar32 = uVar32 + 1;
          } while (uVar32 < uVar40);
          _Var30._M_head_impl =
               (this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
               .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
          lVar44 = (long)(_Var30._M_head_impl)->params;
          uVar32 = uVar40;
        }
        bVar19 = (long)uVar34 < (long)*(int *)(lVar44 + 0x68);
        uVar34 = uVar34 + 1;
      } while (bVar19);
    }
  }
  bVar19 = supports_distance2_graphs((_Var30._M_head_impl)->params);
  if (bVar19) {
    _Var30._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
    _build_exact_path_graphs
              (this,&(_Var30._M_head_impl)->pattern_graph_rows,this->pattern_size,
               &next_pattern_supplemental,1,(_Var30._M_head_impl)->directed,true,true);
    _Var30._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
    _build_exact_path_graphs
              (this,&(_Var30._M_head_impl)->target_graph_rows,this->target_size,
               &next_target_supplemental,1,(_Var30._M_head_impl)->directed,true,false);
  }
  bVar19 = supports_distance3_graphs
                     (((this->_imp)._M_t.
                       super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                       .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                      _M_head_impl)->params);
  _Var30._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
       .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
  if (bVar19) {
    _build_distance3_graphs
              (this,&(_Var30._M_head_impl)->pattern_graph_rows,this->pattern_size,
               &next_pattern_supplemental,true);
    _build_distance3_graphs
              (this,&((this->_imp)._M_t.
                      super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                      .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                     _M_head_impl)->target_graph_rows,this->target_size,&next_target_supplemental,
               false);
    _Var30._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
    if ((((_Var30._M_head_impl)->proof).
         super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
         (element_type *)0x0) && (this->pattern_size != 0)) {
      uVar34 = 0;
      do {
        bVar14 = (byte)uVar34 & 0x3f;
        uVar41 = -2L << bVar14 | 0xfffffffffffffffeU >> 0x40 - bVar14;
        uVar33 = (ulong)((int)uVar34 + 0x3f);
        if (-1 < (int)uVar34) {
          uVar33 = uVar34;
        }
        plVar48 = (long *)0x0;
        iVar28 = (int)uVar33 >> 6;
        local_80 = uVar34;
        do {
          iVar38 = (int)local_80;
          pattern_vertex_for_proof_abi_cxx11_(&named_p_1,this,iVar38);
          iVar29 = (int)plVar48;
          pattern_vertex_for_proof_abi_cxx11_((NamedVertex *)&between_p_and_q,this,iVar29);
          local_410 = plVar48;
          if (iVar38 != iVar29) {
            uVar40 = this->max_graphs * (int)local_80;
            lVar44 = *(long *)&(((this->_imp)._M_t.
                                 super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                 .
                                 super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                ._M_head_impl)->pattern_graph_rows).
                               super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
            ;
            lVar42 = (ulong)((next_pattern_supplemental - 1) + uVar40) * 0x88;
            if (*(uint *)(lVar44 + 0x80 + lVar42) < 0x11) {
              lVar42 = lVar42 + lVar44;
            }
            else {
              lVar42 = *(long *)(lVar44 + lVar42);
            }
            iVar38 = iVar29 + 0x3f;
            if (-1 < iVar29) {
              iVar38 = iVar29;
            }
            lVar46 = (long)(iVar38 >> 6);
            if ((*(ulong *)(lVar42 + lVar46 * 8) >> ((ulong)plVar48 & 0x3f) & 1) != 0) {
              local_f0[1]._0_1_ = '\0';
              local_490 = '\0';
              SVOBitset::SVOBitset(&np,(SVOBitset *)(lVar44 + (ulong)uVar40 * 0x88));
              uVar24 = &np;
              if (0x10 < np.n_words) {
                uVar24 = np._data.short_data[0];
              }
              local_4c0 = (((SVOBitset *)uVar24)->_data).short_data[lVar46];
              local_4c8 = 1L << ((ulong)plVar48 & 0x3f);
              if ((local_4c0 & local_4c8) == 0) {
                SVOBitset::SVOBitset
                          ((SVOBitset *)&patterns,
                           (SVOBitset *)
                           ((ulong)(this->max_graphs * (int)local_410) * 0x88 +
                           *(long *)&(((this->_imp)._M_t.
                                       super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                       .
                                       super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                      ._M_head_impl)->pattern_graph_rows).
                                     super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                           ));
                local_2d8 = np.n_words;
                if ((ulong)np.n_words < 0x11) {
                  auVar59._8_8_ = np._data.short_data[1];
                  auVar59._0_8_ = np._data.short_data[0];
                  auVar59[0x10] = np._data.short_data[2]._0_1_;
                  auVar59._17_7_ = np._data.short_data[2]._1_7_;
                  auVar59._24_8_ = np._data.short_data[3];
                  auVar59._32_32_ = np._data._32_32_;
                  auVar59 = vmovdqu64_avx512f(auVar59);
                  auVar61 = vmovdqu64_avx512f(np._data._64_64_);
                  unique0x00006d80 = vmovdqu64_avx512f(auVar61);
                  _targets = vmovdqu64_avx512f(auVar59);
                }
                else {
                  uVar34 = (ulong)np.n_words << 3;
                  __dest = operator_new__(uVar34);
                  targets.
                  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)__dest;
                  memmove(__dest,np._data.long_data,uVar34);
                }
                SVOBitset::operator&=((SVOBitset *)&targets,(SVOBitset *)&patterns);
                uVar40 = local_2d8;
                pSVar22 = (SVOBitset *)&targets;
                if (0x10 < local_2d8) {
                  pSVar22 = (SVOBitset *)
                            targets.
                            super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                }
                (pSVar22->_data).short_data[iVar28] = (pSVar22->_data).short_data[iVar28] & uVar41;
                ppVar23 = (pointer)&targets;
                if (0x10 < uVar40) {
                  ppVar23 = targets.
                            super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                }
                uVar34 = ~local_4c8;
                pppVar2 = &(((_Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&ppVar23->first)->_M_impl).super__Vector_impl_data._M_start + lVar46
                ;
                *pppVar2 = (pointer)((ulong)*pppVar2 & uVar34);
                bVar19 = SVOBitset::any((SVOBitset *)&targets);
                if (bVar19) {
                  uVar34 = (ulong)local_2d8;
                  pSVar22 = (SVOBitset *)&targets;
                  if (0x10 < uVar34) {
                    pSVar22 = (SVOBitset *)
                              targets.
                              super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                  }
                  iVar38 = -1;
                  if (uVar34 != 0) {
                    lVar44 = 0;
LAB_001276fe:
                    BVar11 = (pSVar22->_data).short_data[0];
                    if (BVar11 == 0) goto code_r0x0012770b;
                    iVar38 = 0;
                    for (; (BVar11 & 1) == 0; BVar11 = BVar11 >> 1 | 0x8000000000000000) {
                      iVar38 = iVar38 + 1;
                    }
                    iVar38 = iVar38 - (int)lVar44;
                  }
LAB_001277aa:
                  pattern_vertex_for_proof_abi_cxx11_((NamedVertex *)&n2_t,this,iVar38);
                  std::optional<std::pair<int,std::__cxx11::string>>::operator=
                            ((optional<std::pair<int,std::__cxx11::string>> *)&p_gds,
                             (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&n2_t);
                  if ((undefined1 *)n2_t._data.short_data[1] !=
                      (undefined1 *)((long)&n2_t._data + 0x18)) {
                    operator_delete((void *)n2_t._data.short_data[1],n2_t._data.short_data[3] + 1);
                  }
                }
                else {
                  uVar33 = (ulong)np.n_words;
                  uVar24 = &np;
                  if (0x10 < uVar33) {
                    uVar24 = np._data.short_data[0];
                  }
                  (((value_type *)uVar24)->_data).short_data[iVar28] =
                       (((value_type *)uVar24)->_data).short_data[iVar28] & uVar41;
                  uVar24 = &np;
                  if (0x10 < uVar33) {
                    uVar24 = np._data.short_data[0];
                  }
                  (((value_type *)uVar24)->_data).short_data[lVar46] =
                       (((value_type *)uVar24)->_data).short_data[lVar46] & uVar34;
                  uVar24 = &np;
                  if (0x10 < uVar33) {
                    uVar24 = np._data.short_data[0];
                  }
                  if (uVar33 != 0) {
                    iVar38 = 0;
                    uVar36 = 0;
LAB_0012778c:
                    uVar39 = (((value_type *)uVar24)->_data).short_data[uVar36];
                    if (uVar39 == 0) goto code_r0x00127795;
                    iVar29 = 0;
                    for (; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000) {
                      iVar29 = iVar29 + 1;
                    }
                    if (iVar29 + 1 != iVar38) {
                      iVar29 = iVar29 - iVar38;
                      do {
                        if (local_f0[1]._0_1_ != '\0') break;
                        pvVar26 = (value_type *)np._data.short_data[0];
                        if ((uint)uVar33 < 0x11) {
                          pvVar26 = &np;
                        }
                        bVar14 = (byte)iVar29 & 0x3f;
                        uVar33 = -2L << bVar14 | 0xfffffffffffffffeU >> 0x40 - bVar14;
                        iVar38 = iVar29 + 0x3f;
                        if (-1 < iVar29) {
                          iVar38 = iVar29;
                        }
                        (pvVar26->_data).short_data[iVar38 >> 6] =
                             (pvVar26->_data).short_data[iVar38 >> 6] & uVar33;
                        SVOBitset::SVOBitset
                                  (&n2_t,(SVOBitset *)
                                         ((ulong)(this->max_graphs * iVar29) * 0x88 +
                                         *(long *)&(((this->_imp)._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                  .
                                                  super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                                  ._M_head_impl)->pattern_graph_rows).
                                                  super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                                         ));
                        uVar40 = n2_t.n_words;
                        uVar36 = (ulong)n2_t.n_words;
                        uVar24 = &n2_t;
                        if (0x10 < uVar36) {
                          uVar24 = n2_t._data.short_data[0];
                        }
                        (((SVOBitset *)uVar24)->_data).short_data[iVar38 >> 6] =
                             (((SVOBitset *)uVar24)->_data).short_data[iVar38 >> 6] & uVar33;
                        uVar24 = &n2_t;
                        if (0x10 < uVar36) {
                          uVar24 = n2_t._data.short_data[0];
                        }
                        (((value_type *)uVar24)->_data).short_data[iVar28] =
                             (((value_type *)uVar24)->_data).short_data[iVar28] & uVar41;
                        uVar24 = &n2_t;
                        if (0x10 < uVar36) {
                          uVar24 = n2_t._data.short_data[0];
                        }
                        (((value_type *)uVar24)->_data).short_data[lVar46] =
                             (((value_type *)uVar24)->_data).short_data[lVar46] & uVar34;
                        uVar24 = &n2_t;
                        if (0x10 < uVar36) {
                          uVar24 = n2_t._data.short_data[0];
                        }
                        if (uVar36 != 0) {
                          iVar38 = 0;
                          uVar33 = 0;
LAB_0012815c:
                          uVar39 = (((value_type *)uVar24)->_data).short_data[uVar33];
                          if (uVar39 == 0) goto code_r0x00128165;
                          iVar43 = 0;
                          for (; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000) {
                            iVar43 = iVar43 + 1;
                          }
                          if (iVar43 + 1 != iVar38) {
                            iVar43 = iVar43 - iVar38;
                            while( true ) {
                              uVar40 = (uint)uVar36;
                              if (local_f0[1]._0_1_ != '\0') goto LAB_00128180;
                              uVar24 = n2_t._data.short_data[0];
                              if (uVar40 < 0x11) {
                                uVar24 = &n2_t;
                              }
                              bVar14 = (byte)iVar43 & 0x3f;
                              iVar38 = iVar43 + 0x3f;
                              if (-1 < iVar43) {
                                iVar38 = iVar43;
                              }
                              (((value_type *)uVar24)->_data).short_data[iVar38 >> 6] =
                                   (((value_type *)uVar24)->_data).short_data[iVar38 >> 6] &
                                   (-2L << bVar14 | 0xfffffffffffffffeU >> 0x40 - bVar14);
                              lVar44 = *(long *)&(((this->_imp)._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                  .
                                                  super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                                  ._M_head_impl)->pattern_graph_rows).
                                                 super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                              ;
                              lVar42 = (ulong)(this->max_graphs * iVar43) * 0x88;
                              if (*(uint *)(lVar44 + 0x80 + lVar42) < 0x11) {
                                lVar44 = lVar44 + lVar42;
                              }
                              else {
                                lVar44 = *(long *)(lVar44 + lVar42);
                              }
                              if ((*(ulong *)(lVar44 + lVar46 * 8) & local_4c8) != 0) {
                                pattern_vertex_for_proof_abi_cxx11_((NamedVertex *)&n_p,this,iVar29)
                                ;
                                std::optional<std::pair<int,std::__cxx11::string>>::operator=
                                          ((optional<std::pair<int,std::__cxx11::string>> *)&p_gds,
                                           (NamedVertex *)&n_p);
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_finish != &aStack_470) {
                                  operator_delete(n_p.super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish,
                                                  (ulong)(aStack_470._M_allocated_capacity + 1));
                                }
                                pattern_vertex_for_proof_abi_cxx11_((NamedVertex *)&n_p,this,iVar43)
                                ;
                                std::optional<std::pair<int,std::__cxx11::string>>::operator=
                                          ((optional<std::pair<int,std::__cxx11::string>> *)&t_gds,
                                           (NamedVertex *)&n_p);
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_finish != &aStack_470) {
                                  operator_delete(n_p.super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish,
                                                  (ulong)(aStack_470._M_allocated_capacity + 1));
                                }
                                uVar36 = (ulong)n2_t.n_words;
                              }
                              uVar40 = (uint)uVar36;
                              uVar24 = &n2_t;
                              if (0x10 < uVar40) {
                                uVar24 = n2_t._data.short_data[0];
                              }
                              if (uVar40 == 0) break;
                              iVar38 = 0;
                              uVar33 = 0;
                              while (uVar39 = (((value_type *)uVar24)->_data).short_data[uVar33],
                                    uVar39 == 0) {
                                uVar33 = uVar33 + 1;
                                iVar38 = iVar38 + -0x40;
                                if (uVar36 == uVar33) goto LAB_00128180;
                              }
                              iVar16 = 0;
                              for (; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000) {
                                iVar16 = iVar16 + 1;
                              }
                              iVar43 = iVar16 - iVar38;
                              if (iVar16 + 1 == iVar38) goto LAB_00128180;
                            }
                            goto LAB_00128195;
                          }
LAB_00128180:
                          if (n2_t._data.short_data[0] != 0 && 0x10 < uVar40) {
                            operator_delete__(n2_t._data.long_data);
                          }
                        }
LAB_00128195:
                        uVar33 = (ulong)np.n_words;
                        pvVar26 = &np;
                        if (0x10 < uVar33) {
                          pvVar26 = (value_type *)np._data.short_data[0];
                        }
                        if (uVar33 == 0) break;
                        iVar38 = 0;
                        uVar36 = 0;
                        while (uVar39 = (pvVar26->_data).short_data[uVar36], uVar39 == 0) {
                          uVar36 = uVar36 + 1;
                          iVar38 = iVar38 + -0x40;
                          if (uVar33 == uVar36) goto LAB_001277f9;
                        }
                        iVar43 = 0;
                        for (; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000) {
                          iVar43 = iVar43 + 1;
                        }
                        iVar29 = iVar43 - iVar38;
                        if (iVar43 + 1 == iVar38) break;
                      } while( true );
                    }
                  }
                }
LAB_001277f9:
                if (local_f0[1]._0_1_ == '\0') {
                  this_00 = (ProofError *)__cxa_allocate_exception(0x28);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&n_t,"Oops, there\'s a bug: missing path from ",
                                 &named_p_1.second);
                  pbVar27 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&n_t," to ");
                  paVar31 = &pbVar27->field_2;
                  n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start = (pointer)(pbVar27->_M_dataplus)._M_p;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start == paVar31) {
                    n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage =
                         (pointer)paVar31->_M_allocated_capacity;
                    aStack_470._M_allocated_capacity = *(long *)((long)&pbVar27->field_2 + 8);
                    n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start =
                         (pointer)&n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage;
                  }
                  else {
                    n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage =
                         (pointer)paVar31->_M_allocated_capacity;
                  }
                  n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_finish = (pointer)pbVar27->_M_string_length;
                  (pbVar27->_M_dataplus)._M_p = (pointer)paVar31;
                  pbVar27->_M_string_length = 0;
                  (pbVar27->field_2)._M_local_buf[0] = '\0';
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&n2_t,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&n_p,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&between_p_and_q.
                                     super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish);
                  ProofError::ProofError(this_00,(string *)&n2_t);
                  __cxa_throw(this_00,&ProofError::typeinfo,ProofError::~ProofError);
                }
                if ((0x10 < local_2d8) &&
                   (targets.
                    super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
                  operator_delete__(targets.
                                    super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
                }
                if ((0x10 < local_148) &&
                   (patterns.
                    super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
                  operator_delete__(patterns.
                                    super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
                }
              }
              if (this->target_size != 0) {
                uVar40 = 0;
                local_450 = (long *)CONCAT44(local_450._4_4_,next_pattern_supplemental - 1);
                do {
                  target_vertex_for_proof_abi_cxx11_((NamedVertex *)&named_n_t,this,uVar40);
                  aStack_470._M_allocated_capacity =
                       (size_type)
                       &n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish;
                  n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_finish._0_4_ = 0;
                  n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage = (pointer)0x0;
                  local_430._M_allocated_capacity =
                       (size_type)
                       &n_t.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish;
                  n_t.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_finish._0_4_ = 0;
                  n_t.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage = (pointer)0x0;
                  named_two_away_from_t.
                  super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  named_n_t_w.
                  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  d3_from_t.
                  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  local_460 = 0;
                  local_420 = 0;
                  named_two_away_from_t.
                  super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  named_two_away_from_t.
                  super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  named_n_t_w.
                  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  named_n_t_w.
                  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  d3_from_t.
                  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  d3_from_t.
                  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  aStack_470._8_8_ = aStack_470._M_allocated_capacity;
                  local_430._8_8_ = local_430._M_allocated_capacity;
                  SVOBitset::SVOBitset
                            ((SVOBitset *)&patterns,
                             (SVOBitset *)
                             ((ulong)(this->max_graphs * uVar40) * 0x88 +
                             *(long *)&(((this->_imp)._M_t.
                                         super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                         .
                                         super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                        ._M_head_impl)->target_graph_rows).
                                       super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                             ));
                  uVar34 = (ulong)local_148;
                  pSVar22 = (SVOBitset *)&patterns;
                  if (0x10 < uVar34) {
                    pSVar22 = (SVOBitset *)
                              patterns.
                              super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                  }
                  uVar32 = uVar40 + 0x3f;
                  if (-1 < (int)uVar40) {
                    uVar32 = uVar40;
                  }
                  (pSVar22->_data).short_data[(int)uVar32 >> 6] =
                       (pSVar22->_data).short_data[(int)uVar32 >> 6] |
                       1L << ((ulong)(uint)((int)uVar40 % 0x40) & 0x3f);
                  pSVar22 = (SVOBitset *)&patterns;
                  if (0x10 < uVar34) {
                    pSVar22 = (SVOBitset *)
                              patterns.
                              super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                  }
                  if (uVar34 != 0) {
                    iVar38 = 0;
                    uVar33 = 0;
LAB_00127973:
                    uVar36 = (pSVar22->_data).short_data[uVar33];
                    if (uVar36 == 0) goto code_r0x0012797c;
                    iVar29 = 0;
                    for (; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
                      iVar29 = iVar29 + 1;
                    }
                    if (iVar29 + 1 != iVar38) {
                      uVar32 = iVar29 - iVar38;
                      do {
                        ppVar23 = patterns.
                                  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
                        if ((uint)uVar34 < 0x11) {
                          ppVar23 = (pointer)&patterns;
                        }
                        uVar47 = uVar32 + 0x3f;
                        if (-1 < (int)uVar32) {
                          uVar47 = uVar32;
                        }
                        bVar14 = (byte)uVar32 & 0x3f;
                        pppVar2 = &(((_Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)&ppVar23->first)->_M_impl).super__Vector_impl_data._M_start
                                  + ((int)uVar47 >> 6);
                        *pppVar2 = (pointer)((ulong)*pppVar2 &
                                            (-2L << bVar14 | 0xfffffffffffffffeU >> 0x40 - bVar14));
                        target_vertex_for_proof_abi_cxx11_((NamedVertex *)&targets,this,uVar32);
                        std::
                        vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                        ::emplace_back<std::pair<int,std::__cxx11::string>>
                                  ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                                    *)&named_two_away_from_t,(NamedVertex *)&targets);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)targets.
                               super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish != aaStack_340) {
                          operator_delete(targets.
                                          super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish,
                                          aaStack_340[0]._M_allocated_capacity + 1);
                        }
                        SVOBitset::SVOBitset
                                  ((SVOBitset *)&targets,
                                   (SVOBitset *)
                                   ((ulong)(uVar32 * this->max_graphs) * 0x88 +
                                   *(long *)&(((this->_imp)._M_t.
                                               super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                               .
                                               super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                              ._M_head_impl)->target_graph_rows).
                                             super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                                   ));
                        uVar20 = local_2d8;
                        uVar34 = (ulong)local_2d8;
                        pSVar22 = (SVOBitset *)&targets;
                        if (0x10 < uVar34) {
                          pSVar22 = (SVOBitset *)
                                    targets.
                                    super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                        }
                        (pSVar22->_data).short_data[(int)uVar47 >> 6] =
                             (pSVar22->_data).short_data[(int)uVar47 >> 6] |
                             1L << ((ulong)uVar32 & 0x3f);
                        pSVar22 = (SVOBitset *)&targets;
                        if (0x10 < uVar34) {
                          pSVar22 = (SVOBitset *)
                                    targets.
                                    super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                        }
                        if (uVar34 != 0) {
                          iVar38 = 0;
                          uVar33 = 0;
LAB_00127c6d:
                          BVar11 = (pSVar22->_data).short_data[uVar33];
                          if (BVar11 == 0) goto code_r0x00127c76;
                          iVar29 = 0;
                          for (; (BVar11 & 1) == 0; BVar11 = BVar11 >> 1 | 0x8000000000000000) {
                            iVar29 = iVar29 + 1;
                          }
                          if (iVar29 + 1 != iVar38) {
                            uVar32 = iVar29 - iVar38;
                            do {
                              ppVar23 = targets.
                                        super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start;
                              if ((uint)uVar34 < 0x11) {
                                ppVar23 = (pointer)&targets;
                              }
                              uVar47 = uVar32 + 0x3f;
                              if (-1 < (int)uVar32) {
                                uVar47 = uVar32;
                              }
                              bVar14 = (byte)uVar32 & 0x3f;
                              pppVar2 = &(((_Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                            *)&ppVar23->first)->_M_impl).super__Vector_impl_data.
                                         _M_start + ((int)uVar47 >> 6);
                              *pppVar2 = (pointer)((ulong)*pppVar2 &
                                                  (-2L << bVar14 |
                                                  0xfffffffffffffffeU >> 0x40 - bVar14));
                              target_vertex_for_proof_abi_cxx11_((NamedVertex *)&n2_t,this,uVar32);
                              std::
                              _Rb_tree<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>,std::_Identity<std::pair<int,std::__cxx11::string>>,std::less<std::pair<int,std::__cxx11::string>>,std::allocator<std::pair<int,std::__cxx11::string>>>
                              ::_M_insert_unique<std::pair<int,std::__cxx11::string>>
                                        ((_Rb_tree<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>,std::_Identity<std::pair<int,std::__cxx11::string>>,std::less<std::pair<int,std::__cxx11::string>>,std::allocator<std::pair<int,std::__cxx11::string>>>
                                          *)&n_p,(pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&n2_t);
                              if ((undefined1 *)n2_t._data.short_data[1] !=
                                  (undefined1 *)((long)&n2_t._data + 0x18)) {
                                operator_delete((void *)n2_t._data.short_data[1],
                                                n2_t._data.short_data[3] + 1);
                              }
                              SVOBitset::SVOBitset
                                        (&n2_t,(SVOBitset *)
                                               ((ulong)(uVar32 * this->max_graphs) * 0x88 +
                                               *(long *)&(((this->_imp)._M_t.
                                                                                                                      
                                                  super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                  .
                                                  super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                                  ._M_head_impl)->target_graph_rows).
                                                  super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                                               ));
                              uVar20 = n2_t.n_words;
                              uVar34 = (ulong)n2_t.n_words;
                              uVar24 = &n2_t;
                              if (0x10 < uVar34) {
                                uVar24 = n2_t._data.short_data[0];
                              }
                              (((SVOBitset *)uVar24)->_data).short_data[(int)uVar47 >> 6] =
                                   (((SVOBitset *)uVar24)->_data).short_data[(int)uVar47 >> 6] |
                                   1L << ((ulong)uVar32 & 0x3f);
                              uVar24 = &n2_t;
                              if (0x10 < uVar34) {
                                uVar24 = n2_t._data.short_data[0];
                              }
                              if (uVar34 != 0) {
                                iVar38 = 0;
                                uVar33 = 0;
LAB_00127e15:
                                uVar36 = (((value_type *)uVar24)->_data).short_data[uVar33];
                                if (uVar36 == 0) goto code_r0x00127e1e;
                                iVar29 = 0;
                                for (; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000)
                                {
                                  iVar29 = iVar29 + 1;
                                }
                                if (iVar29 + 1 != iVar38) {
                                  iVar29 = iVar29 - iVar38;
                                  while( true ) {
                                    uVar24 = n2_t._data.short_data[0];
                                    if ((uint)uVar34 < 0x11) {
                                      uVar24 = &n2_t;
                                    }
                                    bVar14 = (byte)iVar29 & 0x3f;
                                    iVar38 = iVar29 + 0x3f;
                                    if (-1 < iVar29) {
                                      iVar38 = iVar29;
                                    }
                                    (((value_type *)uVar24)->_data).short_data[iVar38 >> 6] =
                                         (((value_type *)uVar24)->_data).short_data[iVar38 >> 6] &
                                         (-2L << bVar14 | 0xfffffffffffffffeU >> 0x40 - bVar14);
                                    target_vertex_for_proof_abi_cxx11_
                                              ((NamedVertex *)&named_d_n_t,this,iVar29);
                                    std::
                                    _Rb_tree<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>,std::_Identity<std::pair<int,std::__cxx11::string>>,std::less<std::pair<int,std::__cxx11::string>>,std::allocator<std::pair<int,std::__cxx11::string>>>
                                    ::_M_insert_unique<std::pair<int,std::__cxx11::string>>
                                              ((_Rb_tree<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>,std::_Identity<std::pair<int,std::__cxx11::string>>,std::less<std::pair<int,std::__cxx11::string>>,std::allocator<std::pair<int,std::__cxx11::string>>>
                                                *)&n_t,(NamedVertex *)&named_d_n_t);
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)named_d_n_t.
                                           super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish != &local_40)
                                    {
                                      operator_delete(named_d_n_t.
                                                                                                            
                                                  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish,
                                                  local_40._M_allocated_capacity + 1);
                                    }
                                    uVar34 = (ulong)n2_t.n_words;
                                    uVar24 = &n2_t;
                                    if (0x10 < uVar34) {
                                      uVar24 = n2_t._data.short_data[0];
                                    }
                                    if (uVar34 == 0) break;
                                    iVar38 = 0;
                                    uVar33 = 0;
                                    while (uVar36 = (((value_type *)uVar24)->_data).short_data
                                                    [uVar33], uVar20 = n2_t.n_words, uVar36 == 0) {
                                      uVar33 = uVar33 + 1;
                                      iVar38 = iVar38 + -0x40;
                                      if (uVar34 == uVar33) goto LAB_00127e37;
                                    }
                                    iVar43 = 0;
                                    for (; (uVar36 & 1) == 0;
                                        uVar36 = uVar36 >> 1 | 0x8000000000000000) {
                                      iVar43 = iVar43 + 1;
                                    }
                                    iVar29 = iVar43 - iVar38;
                                    if (iVar43 + 1 == iVar38) goto LAB_00127e37;
                                  }
                                  goto LAB_00127e4c;
                                }
LAB_00127e37:
                                if (n2_t._data.short_data[0] != 0 && 0x10 < uVar20) {
                                  operator_delete__(n2_t._data.long_data);
                                }
                              }
LAB_00127e4c:
                              uVar34 = (ulong)local_2d8;
                              ppVar23 = (pointer)&targets;
                              if (0x10 < uVar34) {
                                ppVar23 = targets.
                                          super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start;
                              }
                              if (uVar34 == 0) goto LAB_00127cad;
                              iVar38 = 0;
                              uVar33 = 0;
                              while (ppVar13 = (&(((
                                                  _Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)&ppVar23->first)->_M_impl).
                                                 super__Vector_impl_data._M_start)[uVar33],
                                    uVar20 = local_2d8, ppVar13 == (pointer)0x0) {
                                uVar33 = uVar33 + 1;
                                iVar38 = iVar38 + -0x40;
                                if (uVar34 == uVar33) goto LAB_00127c98;
                              }
                              iVar29 = 0;
                              for (; ((ulong)ppVar13 & 1) == 0;
                                  ppVar13 = (pointer)((ulong)ppVar13 >> 1 | 0x8000000000000000)) {
                                iVar29 = iVar29 + 1;
                              }
                              uVar32 = iVar29 - iVar38;
                              if (iVar29 + 1 == iVar38) break;
                            } while( true );
                          }
LAB_00127c98:
                          if (targets.
                              super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0 &&
                              0x10 < uVar20) {
                            operator_delete__(targets.
                                              super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                          }
                        }
LAB_00127cad:
                        uVar34 = (ulong)local_148;
                        ppVar23 = (pointer)&patterns;
                        if (0x10 < uVar34) {
                          ppVar23 = patterns.
                                    super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                        }
                        if (uVar34 == 0) break;
                        iVar38 = 0;
                        uVar33 = 0;
                        while (ppVar13 = (&(((_Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                              *)&ppVar23->first)->_M_impl).super__Vector_impl_data.
                                           _M_start)[uVar33], ppVar13 == (pointer)0x0) {
                          uVar33 = uVar33 + 1;
                          iVar38 = iVar38 + -0x40;
                          if (uVar34 == uVar33) goto LAB_0012799a;
                        }
                        iVar29 = 0;
                        for (; ((ulong)ppVar13 & 1) == 0;
                            ppVar13 = (pointer)((ulong)ppVar13 >> 1 | 0x8000000000000000)) {
                          iVar29 = iVar29 + 1;
                        }
                        uVar32 = iVar29 - iVar38;
                        if (iVar29 + 1 == iVar38) break;
                      } while( true );
                    }
                  }
LAB_0012799a:
                  std::
                  vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                  ::_M_assign_aux<std::_Rb_tree_const_iterator<std::pair<int,std::__cxx11::string>>>
                            ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                              *)&named_n_t_w,aStack_470._M_allocated_capacity,
                             &n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish);
                  std::
                  vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                  ::_M_assign_aux<std::_Rb_tree_const_iterator<std::pair<int,std::__cxx11::string>>>
                            ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                              *)&d3_from_t,local_430._0_8_,
                             &n_t.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish);
                  if ((local_4c8 & local_4c0) == 0) {
                    pPVar12 = (((this->_imp)._M_t.
                                super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                .
                                super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                               ._M_head_impl)->proof).
                              super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr;
                    if (local_490 == '\x01') {
                      Proof::create_distance3_graphs
                                (pPVar12,(int)local_450,&named_p_1,(NamedVertex *)&between_p_and_q,
                                 (NamedVertex *)&p_gds,(NamedVertex *)&t_gds,
                                 (NamedVertex *)&named_n_t,
                                 (vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&named_two_away_from_t,&named_n_t_w,&d3_from_t);
                    }
                    else {
                      Proof::create_distance3_graphs_but_actually_distance_2
                                (pPVar12,(int)local_450,&named_p_1,(NamedVertex *)&between_p_and_q,
                                 (NamedVertex *)&p_gds,(NamedVertex *)&named_n_t,
                                 (vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&named_two_away_from_t,&named_n_t_w,&d3_from_t);
                    }
                  }
                  else {
                    Proof::create_distance3_graphs_but_actually_distance_1
                              ((((this->_imp)._M_t.
                                 super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                 .
                                 super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                ._M_head_impl)->proof).
                               super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr,(int)local_450,&named_p_1,(NamedVertex *)&between_p_and_q,
                               (NamedVertex *)&named_n_t,&d3_from_t);
                  }
                  if ((0x10 < local_148) &&
                     (patterns.
                      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
                    operator_delete__(patterns.
                                      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
                  }
                  std::
                  _Rb_tree<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::~_Rb_tree((_Rb_tree<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&n_t);
                  std::
                  _Rb_tree<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::~_Rb_tree((_Rb_tree<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&n_p);
                  std::
                  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::~vector(&d3_from_t);
                  std::
                  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::~vector(&named_n_t_w);
                  std::
                  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::~vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&named_two_away_from_t);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)named_n_t.
                         super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish != &local_120) {
                    operator_delete(named_n_t.
                                    super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish,
                                    local_120._M_allocated_capacity + 1);
                  }
                  uVar40 = uVar40 + 1;
                } while (uVar40 < this->target_size);
              }
              if ((0x10 < np.n_words) && ((value_type *)np._data.short_data[0] != (value_type *)0x0)
                 ) {
                operator_delete__(np._data.long_data);
              }
              if (local_490 == '\x01') {
                local_490 = '\0';
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)t_gds.
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish != &aStack_4a0) {
                  operator_delete(t_gds.
                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,
                                  aStack_4a0._M_allocated_capacity + 1);
                }
              }
              if (local_f0[1]._0_1_ == '\x01') {
                local_f0[1]._0_1_ = '\0';
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)p_gds.
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish != local_f0) {
                  operator_delete(p_gds.
                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,
                                  local_f0[0]._M_allocated_capacity + 1);
                }
              }
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)between_p_and_q.
                 super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish != &local_230) {
            operator_delete(between_p_and_q.
                            super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish,
                            local_230._M_allocated_capacity + 1);
          }
          plVar48 = local_410;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)named_p_1.second._M_dataplus._M_p != &named_p_1.second.field_2) {
            operator_delete(named_p_1.second._M_dataplus._M_p,
                            named_p_1.second.field_2._M_allocated_capacity + 1);
          }
          uVar40 = (int)plVar48 + 1;
          plVar48 = (long *)(ulong)uVar40;
        } while (uVar40 < this->pattern_size);
        uVar40 = (int)local_80 + 1;
        uVar34 = (ulong)uVar40;
      } while (uVar40 < this->pattern_size);
      _Var30._M_head_impl =
           (this->_imp)._M_t.
           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           ._M_t.
           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
    }
  }
  bVar19 = supports_k4_graphs((_Var30._M_head_impl)->params);
  if (bVar19) {
    _build_k4_graphs(this,&((this->_imp)._M_t.
                            super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                            .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                           _M_head_impl)->pattern_graph_rows,this->pattern_size,
                     &next_pattern_supplemental,true);
    _build_k4_graphs(this,&((this->_imp)._M_t.
                            super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                            .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                           _M_head_impl)->target_graph_rows,this->target_size,
                     &next_target_supplemental,false);
  }
  lVar44 = (long)((this->_imp)._M_t.
                  super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                  .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl
                 )->params;
  plVar48 = *(long **)(lVar44 + 0x70);
  local_410 = (long *)(lVar44 + 0x70);
  if (plVar48 != local_410) {
    uVar40 = this->pattern_size;
    do {
      _build_extra_shape(this,&((this->_imp)._M_t.
                                super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                .
                                super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                               ._M_head_impl)->pattern_graph_rows,uVar40,&next_pattern_supplemental,
                         (InputGraph *)plVar48[3],*(bool *)((long)plVar48 + 0x14),(int)plVar48[2],
                         true);
      local_450 = plVar48;
      _build_extra_shape(this,&((this->_imp)._M_t.
                                super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                .
                                super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                               ._M_head_impl)->target_graph_rows,this->target_size,
                         &next_target_supplemental,(InputGraph *)plVar48[3],
                         *(bool *)((long)plVar48 + 0x14),(int)plVar48[2],false);
      uVar40 = this->pattern_size;
      if (uVar40 != 0 &&
          *(long *)&(((this->_imp)._M_t.
                      super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                      .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                     _M_head_impl)->proof).
                    super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2> != 0) {
        uVar32 = 0;
        iVar28 = next_pattern_supplemental - 1;
        do {
          uVar34 = 0;
          local_4c0 = CONCAT44(local_4c0._4_4_,uVar32);
          do {
            pattern_vertex_for_proof_abi_cxx11_((NamedVertex *)&patterns,this,uVar32);
            iVar38 = (int)uVar34;
            pattern_vertex_for_proof_abi_cxx11_((NamedVertex *)&targets,this,iVar38);
            lVar44 = *(long *)&(((this->_imp)._M_t.
                                 super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                 .
                                 super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                ._M_head_impl)->pattern_graph_rows).
                               super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
            ;
            lVar42 = (ulong)(this->max_graphs * uVar32 + iVar28) * 0x88;
            if (*(uint *)(lVar44 + 0x80 + lVar42) < 0x11) {
              lVar44 = lVar44 + lVar42;
            }
            else {
              lVar44 = *(long *)(lVar44 + lVar42);
            }
            iVar29 = iVar38 + 0x3f;
            if (-1 < iVar38) {
              iVar29 = iVar38;
            }
            local_4c8 = uVar34;
            if (((*(ulong *)(lVar44 + (long)(iVar29 >> 6) * 8) >> (uVar34 & 0x3f) & 1) != 0) &&
               (this->target_size != 0)) {
              uVar40 = 0;
              do {
                target_vertex_for_proof_abi_cxx11_((NamedVertex *)&n2_t,this,uVar40);
                t_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                t_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                t_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                SVOBitset::SVOBitset
                          (&np,(SVOBitset *)
                               ((ulong)(this->max_graphs * uVar40 + iVar28) * 0x88 +
                               *(long *)&(((this->_imp)._M_t.
                                           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                           .
                                           super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                          ._M_head_impl)->target_graph_rows).
                                         super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                               ));
                uVar34 = (ulong)np.n_words;
                uVar24 = &np;
                if (0x10 < uVar34) {
                  uVar24 = np._data.short_data[0];
                }
                if (uVar34 != 0) {
                  iVar38 = 0;
                  uVar33 = 0;
LAB_0012855f:
                  BVar11 = (((SVOBitset *)uVar24)->_data).short_data[uVar33];
                  if (BVar11 == 0) goto code_r0x00128568;
                  iVar29 = 0;
                  for (; (BVar11 & 1) == 0; BVar11 = BVar11 >> 1 | 0x8000000000000000) {
                    iVar29 = iVar29 + 1;
                  }
                  if (iVar29 + 1 == iVar38) goto LAB_00128587;
                  iVar29 = iVar29 - iVar38;
                  while( true ) {
                    pvVar26 = (value_type *)np._data.short_data[0];
                    if ((uint)uVar34 < 0x11) {
                      pvVar26 = &np;
                    }
                    bVar14 = (byte)iVar29 & 0x3f;
                    iVar38 = iVar29 + 0x3f;
                    if (-1 < iVar29) {
                      iVar38 = iVar29;
                    }
                    (pvVar26->_data).short_data[iVar38 >> 6] =
                         (pvVar26->_data).short_data[iVar38 >> 6] &
                         (-2L << bVar14 | 0xfffffffffffffffeU >> 0x40 - bVar14);
                    target_vertex_for_proof_abi_cxx11_((NamedVertex *)&p_gds,this,iVar29);
                    std::
                    vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                    ::emplace_back<std::pair<int,std::__cxx11::string>>
                              ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                                *)&t_gds,(NamedVertex *)&p_gds);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)p_gds.
                           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish != local_f0) {
                      operator_delete(p_gds.
                                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish,
                                      local_f0[0]._M_allocated_capacity + 1);
                    }
                    uVar34 = (ulong)np.n_words;
                    pvVar26 = &np;
                    if (0x10 < uVar34) {
                      pvVar26 = (value_type *)np._data.short_data[0];
                    }
                    if (uVar34 == 0) break;
                    iVar38 = 0;
                    uVar33 = 0;
                    while (uVar41 = (pvVar26->_data).short_data[uVar33], uVar41 == 0) {
                      uVar33 = uVar33 + 1;
                      iVar38 = iVar38 + -0x40;
                      if (uVar34 == uVar33) goto LAB_00128587;
                    }
                    iVar43 = 0;
                    for (; (uVar41 & 1) == 0; uVar41 = uVar41 >> 1 | 0x8000000000000000) {
                      iVar43 = iVar43 + 1;
                    }
                    iVar29 = iVar43 - iVar38;
                    if (iVar43 + 1 == iVar38) break;
                  }
                }
LAB_00128587:
                Proof::hack_in_shape_graph
                          ((((this->_imp)._M_t.
                             super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                             .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                            _M_head_impl)->proof).
                           super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr,iVar28,(NamedVertex *)&patterns,(NamedVertex *)&targets,
                           (NamedVertex *)&n2_t,
                           (vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&t_gds);
                if ((0x10 < np.n_words) && (np._data.short_data[0] != 0)) {
                  operator_delete__(np._data.long_data);
                }
                std::
                vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::~vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&t_gds);
                if ((undefined1 *)n2_t._data.short_data[1] !=
                    (undefined1 *)((long)&n2_t._data + 0x18)) {
                  operator_delete((void *)n2_t._data.short_data[1],n2_t._data.short_data[3] + 1);
                }
                uVar40 = uVar40 + 1;
              } while (uVar40 < this->target_size);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)targets.
                   super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish != aaStack_340) {
              operator_delete(targets.
                              super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish,
                              aaStack_340[0]._M_allocated_capacity + 1);
            }
            uVar34 = local_4c8;
            uVar32 = (uint)local_4c0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)patterns.
                   super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish != aaStack_1b0) {
              operator_delete(patterns.
                              super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish,
                              aaStack_1b0[0]._M_allocated_capacity + 1);
            }
            uVar40 = this->pattern_size;
            uVar47 = (int)uVar34 + 1;
            uVar34 = (ulong)uVar47;
          } while (uVar47 < uVar40);
          uVar32 = uVar32 + 1;
        } while (uVar32 < uVar40);
      }
      plVar48 = (long *)*local_450;
    } while (plVar48 != local_410);
  }
  uVar32 = next_target_supplemental;
  uVar40 = next_pattern_supplemental;
  if (((next_pattern_supplemental != this->max_graphs) ||
      (next_target_supplemental != this->max_graphs)) ||
     (*(size_t *)
       ((long)&((this->_imp)._M_t.
                super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                ._M_t.
                super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl)
               ->supplemental_graph_names + 0x10) != (ulong)next_pattern_supplemental)) {
    this_01 = (UnsupportedConfiguration *)__cxa_allocate_exception(0x28);
    std::__cxx11::to_string((string *)&n_t,uVar40);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&n_p,
                   "something has gone wrong with supplemental graph indexing: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&n_t);
    pbVar27 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&n_p," ");
    paVar31 = &pbVar27->field_2;
    t_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)(pbVar27->_M_dataplus)._M_p;
    if (t_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
        .super__Vector_impl_data._M_start == (pointer)paVar31) {
      t_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)paVar31->_M_allocated_capacity;
      aStack_4a0._M_allocated_capacity = *(size_type *)((long)&pbVar27->field_2 + 8);
      t_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)&t_gds.
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    else {
      t_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)paVar31->_M_allocated_capacity;
    }
    t_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)pbVar27->_M_string_length;
    (pbVar27->_M_dataplus)._M_p = (pointer)paVar31;
    pbVar27->_M_string_length = 0;
    (pbVar27->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::to_string((string *)&named_p_1,uVar32);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_gds,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&t_gds,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&named_p_1);
    pbVar27 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_gds," "
                    );
    paVar31 = &pbVar27->field_2;
    n2_t._data.short_data[0] = (BitWord)(pbVar27->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)n2_t._data.short_data[0] == paVar31) {
      n2_t._data.short_data[2] = paVar31->_M_allocated_capacity;
      n2_t._data.short_data[3] = *(BitWord *)((long)&pbVar27->field_2 + 8);
      n2_t._data.short_data[0] = (BitWord)(BitWord *)((long)&n2_t._data + 0x10);
    }
    else {
      n2_t._data.short_data[2] = paVar31->_M_allocated_capacity;
    }
    n2_t._data.short_data[1] = pbVar27->_M_string_length;
    (pbVar27->_M_dataplus)._M_p = (pointer)paVar31;
    pbVar27->_M_string_length = 0;
    (pbVar27->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::to_string((string *)&between_p_and_q,this->max_graphs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&n2_t,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &between_p_and_q);
    pbVar27 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets,
                     " ");
    paVar31 = &pbVar27->field_2;
    patterns.
    super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)(pbVar27->_M_dataplus)._M_p;
    if (patterns.
        super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start == (pointer)paVar31) {
      patterns.
      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)paVar31->_M_allocated_capacity;
      aaStack_1b0[0]._0_8_ = *(BitWord *)((long)&pbVar27->field_2 + 8);
      patterns.
      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)&patterns.
                     super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    else {
      patterns.
      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)paVar31->_M_allocated_capacity;
    }
    patterns.
    super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)pbVar27->_M_string_length;
    (pbVar27->_M_dataplus)._M_p = (pointer)paVar31;
    pbVar27->_M_string_length = 0;
    (pbVar27->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::to_string
              ((string *)&named_n_t,
               *(size_t *)
                ((long)&((this->_imp)._M_t.
                         super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                         .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                        _M_head_impl)->supplemental_graph_names + 0x10));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&np,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&patterns,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&named_n_t);
    UnsupportedConfiguration::UnsupportedConfiguration(this_01,(string *)&np);
    __cxa_throw(this_01,&UnsupportedConfiguration::typeinfo,
                UnsupportedConfiguration::~UnsupportedConfiguration);
  }
  if (1 < next_pattern_supplemental) {
    uVar34 = 1;
    lVar44 = 0x18;
    do {
      _Var30._M_head_impl =
           (this->_imp)._M_t.
           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           ._M_t.
           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
      lVar42 = *(long *)&((_Var30._M_head_impl)->patterns_degrees).
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ;
      uVar33 = ((long)*(pointer *)((long)&(_Var30._M_head_impl)->patterns_degrees + 8) - lVar42 >> 3
               ) * -0x5555555555555555;
      if (uVar33 < uVar34 || uVar33 - uVar34 == 0) goto LAB_00128d35;
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)(lVar42 + lVar44),(ulong)this->pattern_size);
      _Var30._M_head_impl =
           (this->_imp)._M_t.
           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           ._M_t.
           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
      lVar42 = *(long *)&((_Var30._M_head_impl)->targets_degrees).
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ;
      uVar33 = ((long)*(pointer *)((long)&(_Var30._M_head_impl)->targets_degrees + 8) - lVar42 >> 3)
               * -0x5555555555555555;
      if (uVar33 < uVar34 || uVar33 - uVar34 == 0) goto LAB_00128d35;
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)(lVar42 + lVar44),(ulong)this->target_size);
      uVar40 = this->max_graphs;
      uVar34 = uVar34 + 1;
      lVar44 = lVar44 + 0x18;
    } while (uVar34 < uVar40);
    if (1 < uVar40) {
      auVar59 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      _Var30._M_head_impl =
           (this->_imp)._M_t.
           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           ._M_t.
           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
      uVar41 = 1;
      do {
        if (this->pattern_size != 0) {
          lVar44 = *(long *)&((_Var30._M_head_impl)->patterns_degrees).
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ;
          lVar42 = *(long *)&((_Var30._M_head_impl)->pattern_graph_rows).
                             super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
          ;
          uVar39 = 0;
          plVar48 = (long *)(lVar44 + uVar41 * 0x18);
          uVar36 = ((long)*(pointer *)((long)&(_Var30._M_head_impl)->patterns_degrees + 8) - lVar44
                   >> 3) * -0x5555555555555555;
          do {
            lVar44 = (ulong)(this->max_graphs * (int)uVar39 + (int)uVar41) * 0x88;
            uVar34 = (ulong)*(uint *)(lVar42 + 0x80 + lVar44);
            if (uVar34 < 0x11) {
              lVar44 = lVar44 + lVar42;
            }
            else {
              lVar44 = *(long *)(lVar42 + lVar44);
            }
            if (uVar34 == 0) {
              uVar65 = 0;
            }
            else {
              auVar60 = vpbroadcastq_avx512f();
              uVar33 = 0;
              auVar61 = ZEXT1664((undefined1  [16])0x0);
              do {
                auVar62 = auVar61;
                auVar61 = vpbroadcastq_avx512f();
                auVar61 = vporq_avx512f(auVar61,auVar59);
                uVar15 = vpcmpuq_avx512f(auVar61,auVar60,2);
                auVar61 = vmovdqu64_avx512f(*(undefined1 (*) [64])(lVar44 + uVar33 * 8));
                auVar63._8_8_ = (ulong)((byte)(uVar15 >> 1) & 1) * auVar61._8_8_;
                auVar63._0_8_ = (ulong)((byte)uVar15 & 1) * auVar61._0_8_;
                auVar63._16_8_ = (ulong)((byte)(uVar15 >> 2) & 1) * auVar61._16_8_;
                auVar63._24_8_ = (ulong)((byte)(uVar15 >> 3) & 1) * auVar61._24_8_;
                auVar63._32_8_ = (ulong)((byte)(uVar15 >> 4) & 1) * auVar61._32_8_;
                auVar63._40_8_ = (ulong)((byte)(uVar15 >> 5) & 1) * auVar61._40_8_;
                auVar63._48_8_ = (ulong)((byte)(uVar15 >> 6) & 1) * auVar61._48_8_;
                auVar63._56_8_ = (uVar15 >> 7) * auVar61._56_8_;
                uVar33 = uVar33 + 8;
                auVar61 = vpopcntq_avx512_vpopcntdq(auVar63);
                auVar54 = vpmovqd_avx512f(auVar61);
                auVar54 = vpaddd_avx2(auVar62._0_32_,auVar54);
                auVar61 = ZEXT3264(auVar54);
              } while ((uVar34 + 7 & 0x1fffffff8) != uVar33);
              auVar54 = vmovdqa32_avx512vl(auVar54);
              bVar19 = (bool)((byte)uVar15 & 1);
              auVar52._0_4_ = (uint)bVar19 * auVar54._0_4_ | (uint)!bVar19 * auVar62._0_4_;
              bVar19 = (bool)((byte)(uVar15 >> 1) & 1);
              auVar52._4_4_ = (uint)bVar19 * auVar54._4_4_ | (uint)!bVar19 * auVar62._4_4_;
              bVar19 = (bool)((byte)(uVar15 >> 2) & 1);
              auVar52._8_4_ = (uint)bVar19 * auVar54._8_4_ | (uint)!bVar19 * auVar62._8_4_;
              bVar19 = (bool)((byte)(uVar15 >> 3) & 1);
              auVar52._12_4_ = (uint)bVar19 * auVar54._12_4_ | (uint)!bVar19 * auVar62._12_4_;
              bVar19 = (bool)((byte)(uVar15 >> 4) & 1);
              auVar57._16_4_ = (uint)bVar19 * auVar54._16_4_ | (uint)!bVar19 * auVar62._16_4_;
              auVar57._0_16_ = auVar52;
              bVar19 = (bool)((byte)(uVar15 >> 5) & 1);
              auVar57._20_4_ = (uint)bVar19 * auVar54._20_4_ | (uint)!bVar19 * auVar62._20_4_;
              bVar19 = (bool)((byte)(uVar15 >> 6) & 1);
              auVar57._24_4_ = (uint)bVar19 * auVar54._24_4_ | (uint)!bVar19 * auVar62._24_4_;
              bVar19 = SUB81(uVar15 >> 7,0);
              auVar57._28_4_ = (uint)bVar19 * auVar54._28_4_ | (uint)!bVar19 * auVar62._28_4_;
              auVar50 = vphaddd_avx(auVar57._16_16_,auVar52);
              auVar50 = vphaddd_avx(auVar50,auVar50);
              auVar50 = vphaddd_avx(auVar50,auVar50);
              uVar65 = auVar50._0_4_;
            }
            uVar33 = uVar36;
            uVar34 = uVar41;
            if (uVar36 < uVar41 || uVar36 - uVar41 == 0) goto LAB_00128d35;
            lVar44 = *plVar48;
            uVar33 = plVar48[1] - lVar44 >> 2;
            uVar34 = uVar39;
            if (uVar33 <= uVar39) goto LAB_00128d35;
            *(undefined4 *)(lVar44 + uVar39 * 4) = uVar65;
            uVar40 = (int)uVar39 + 1;
            uVar39 = (ulong)uVar40;
          } while (uVar40 < this->pattern_size);
        }
        if (this->target_size == 0) {
          uVar34 = 0;
        }
        else {
          lVar44 = *(long *)&((_Var30._M_head_impl)->targets_degrees).
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ;
          lVar42 = *(long *)&((_Var30._M_head_impl)->target_graph_rows).
                             super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
          ;
          uVar39 = 0;
          plVar48 = (long *)(lVar44 + uVar41 * 0x18);
          uVar36 = ((long)*(pointer *)((long)&(_Var30._M_head_impl)->targets_degrees + 8) - lVar44
                   >> 3) * -0x5555555555555555;
          do {
            lVar44 = (ulong)(this->max_graphs * (int)uVar39 + (int)uVar41) * 0x88;
            uVar34 = (ulong)*(uint *)(lVar42 + 0x80 + lVar44);
            if (uVar34 < 0x11) {
              lVar44 = lVar44 + lVar42;
            }
            else {
              lVar44 = *(long *)(lVar42 + lVar44);
            }
            if (uVar34 == 0) {
              uVar65 = 0;
            }
            else {
              auVar60 = vpbroadcastq_avx512f();
              uVar33 = 0;
              auVar61 = ZEXT1664((undefined1  [16])0x0);
              do {
                auVar62 = auVar61;
                auVar61 = vpbroadcastq_avx512f();
                auVar61 = vporq_avx512f(auVar61,auVar59);
                uVar15 = vpcmpuq_avx512f(auVar61,auVar60,2);
                auVar61 = vmovdqu64_avx512f(*(undefined1 (*) [64])(lVar44 + uVar33 * 8));
                auVar64._8_8_ = (ulong)((byte)(uVar15 >> 1) & 1) * auVar61._8_8_;
                auVar64._0_8_ = (ulong)((byte)uVar15 & 1) * auVar61._0_8_;
                auVar64._16_8_ = (ulong)((byte)(uVar15 >> 2) & 1) * auVar61._16_8_;
                auVar64._24_8_ = (ulong)((byte)(uVar15 >> 3) & 1) * auVar61._24_8_;
                auVar64._32_8_ = (ulong)((byte)(uVar15 >> 4) & 1) * auVar61._32_8_;
                auVar64._40_8_ = (ulong)((byte)(uVar15 >> 5) & 1) * auVar61._40_8_;
                auVar64._48_8_ = (ulong)((byte)(uVar15 >> 6) & 1) * auVar61._48_8_;
                auVar64._56_8_ = (uVar15 >> 7) * auVar61._56_8_;
                uVar33 = uVar33 + 8;
                auVar61 = vpopcntq_avx512_vpopcntdq(auVar64);
                auVar54 = vpmovqd_avx512f(auVar61);
                auVar54 = vpaddd_avx2(auVar62._0_32_,auVar54);
                auVar61 = ZEXT3264(auVar54);
              } while ((uVar34 + 7 & 0x1fffffff8) != uVar33);
              auVar54 = vmovdqa32_avx512vl(auVar54);
              bVar19 = (bool)((byte)uVar15 & 1);
              auVar53._0_4_ = (uint)bVar19 * auVar54._0_4_ | (uint)!bVar19 * auVar62._0_4_;
              bVar19 = (bool)((byte)(uVar15 >> 1) & 1);
              auVar53._4_4_ = (uint)bVar19 * auVar54._4_4_ | (uint)!bVar19 * auVar62._4_4_;
              bVar19 = (bool)((byte)(uVar15 >> 2) & 1);
              auVar53._8_4_ = (uint)bVar19 * auVar54._8_4_ | (uint)!bVar19 * auVar62._8_4_;
              bVar19 = (bool)((byte)(uVar15 >> 3) & 1);
              auVar53._12_4_ = (uint)bVar19 * auVar54._12_4_ | (uint)!bVar19 * auVar62._12_4_;
              bVar19 = (bool)((byte)(uVar15 >> 4) & 1);
              auVar58._16_4_ = (uint)bVar19 * auVar54._16_4_ | (uint)!bVar19 * auVar62._16_4_;
              auVar58._0_16_ = auVar53;
              bVar19 = (bool)((byte)(uVar15 >> 5) & 1);
              auVar58._20_4_ = (uint)bVar19 * auVar54._20_4_ | (uint)!bVar19 * auVar62._20_4_;
              bVar19 = (bool)((byte)(uVar15 >> 6) & 1);
              auVar58._24_4_ = (uint)bVar19 * auVar54._24_4_ | (uint)!bVar19 * auVar62._24_4_;
              bVar19 = SUB81(uVar15 >> 7,0);
              auVar58._28_4_ = (uint)bVar19 * auVar54._28_4_ | (uint)!bVar19 * auVar62._28_4_;
              auVar50 = vphaddd_avx(auVar58._16_16_,auVar53);
              auVar50 = vphaddd_avx(auVar50,auVar50);
              auVar50 = vphaddd_avx(auVar50,auVar50);
              uVar65 = auVar50._0_4_;
            }
            uVar33 = uVar36;
            uVar34 = uVar41;
            if (uVar36 < uVar41 || uVar36 - uVar41 == 0) goto LAB_00128d35;
            lVar44 = *plVar48;
            uVar33 = plVar48[1] - lVar44 >> 2;
            uVar34 = uVar39;
            if (uVar33 <= uVar39) goto LAB_00128d35;
            *(undefined4 *)(lVar44 + uVar39 * 4) = uVar65;
            uVar40 = (int)uVar39 + 1;
            uVar39 = (ulong)uVar40;
            uVar34 = (ulong)this->target_size;
          } while (uVar40 < this->target_size);
        }
        uVar40 = this->max_graphs;
        uVar41 = uVar41 + 1;
      } while (uVar41 < uVar40);
      goto LAB_00128a78;
    }
  }
  uVar34 = (ulong)this->target_size;
LAB_00128a78:
  _Var30._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
       .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
  if ((int)uVar34 != 0) {
    iVar28 = (_Var30._M_head_impl)->largest_target_degree;
    uVar33 = 0;
    lVar44 = **(long **)&((_Var30._M_head_impl)->targets_degrees).
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ;
    do {
      iVar38 = *(int *)(lVar44 + uVar33 * 4);
      if (iVar28 <= iVar38) {
        iVar28 = iVar38;
      }
      uVar33 = uVar33 + 1;
      (_Var30._M_head_impl)->largest_target_degree = iVar28;
    } while (uVar34 != uVar33);
    _Var30._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
  }
  uVar32 = this->pattern_size;
  if ((ulong)uVar32 != 0) {
    lVar44 = *(long *)&((_Var30._M_head_impl)->pattern_loops).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl;
    uVar33 = 0;
    uVar41 = 0;
    do {
      if (*(int *)(lVar44 + uVar41 * 4) != 0) {
        lVar42 = *(long *)&((_Var30._M_head_impl)->pattern_graph_rows).
                           super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                           ._M_impl;
        lVar46 = uVar33 * 0x88;
        if (*(uint *)(lVar42 + 0x80 + lVar46) < 0x11) {
          lVar42 = lVar42 + lVar46;
        }
        else {
          lVar42 = *(long *)(lVar42 + lVar46);
        }
        iVar28 = (int)uVar41;
        iVar38 = iVar28 + 0x3f;
        if (-1 < iVar28) {
          iVar38 = iVar28;
        }
        puVar3 = (ulong *)(lVar42 + (long)(iVar38 >> 6) * 8);
        *puVar3 = *puVar3 | 1L << (uVar41 & 0x3f);
      }
      uVar41 = uVar41 + 1;
      uVar33 = (ulong)((int)uVar33 + uVar40);
    } while (uVar32 != uVar41);
  }
  if ((int)uVar34 != 0) {
    lVar44 = *(long *)&((_Var30._M_head_impl)->target_loops).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl;
    uVar33 = 0;
    uVar41 = 0;
    do {
      if (*(int *)(lVar44 + uVar41 * 4) != 0) {
        lVar42 = *(long *)&((_Var30._M_head_impl)->target_graph_rows).
                           super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                           ._M_impl;
        lVar46 = uVar33 * 0x88;
        if (*(uint *)(lVar42 + 0x80 + lVar46) < 0x11) {
          lVar42 = lVar42 + lVar46;
        }
        else {
          lVar42 = *(long *)(lVar42 + lVar46);
        }
        iVar28 = (int)uVar41;
        iVar38 = iVar28 + 0x3f;
        if (-1 < iVar28) {
          iVar38 = iVar28;
        }
        puVar3 = (ulong *)(lVar42 + (long)(iVar38 >> 6) * 8);
        *puVar3 = *puVar3 | 1L << (uVar41 & 0x3f);
      }
      uVar41 = uVar41 + 1;
      uVar33 = (ulong)((int)uVar33 + uVar40);
    } while (uVar34 != uVar41);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&(_Var30._M_head_impl)->pattern_adjacencies_bits,(ulong)(uVar32 * uVar32));
  uVar40 = this->max_graphs;
  if (uVar40 != 0) {
    uVar32 = this->pattern_size;
    uVar20 = 0;
    uVar47 = uVar32;
    do {
      if (uVar47 == 0) {
        uVar47 = 0;
      }
      else {
        uVar40 = 0;
        do {
          if (uVar32 != 0) {
            uVar34 = 0;
            do {
              _Var30._M_head_impl =
                   (this->_imp)._M_t.
                   super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                   .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                   _M_head_impl;
              lVar44 = *(long *)&((_Var30._M_head_impl)->pattern_graph_rows).
                                 super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
              ;
              lVar42 = (ulong)(this->max_graphs * uVar40 + uVar20) * 0x88;
              if (*(uint *)(lVar44 + 0x80 + lVar42) < 0x11) {
                lVar44 = lVar44 + lVar42;
              }
              else {
                lVar44 = *(long *)(lVar44 + lVar42);
              }
              iVar28 = (int)uVar34;
              iVar38 = iVar28 + 0x3f;
              if (-1 < iVar28) {
                iVar38 = iVar28;
              }
              if ((*(ulong *)(lVar44 + (long)(iVar38 >> 6) * 8) >> (uVar34 & 0x3f) & 1) != 0) {
                pbVar4 = (byte *)(*(long *)&((_Var30._M_head_impl)->pattern_adjacencies_bits).
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                 + (ulong)(uVar32 * uVar40 + iVar28));
                *pbVar4 = *pbVar4 | (byte)(1 << (uVar20 & 0x1f));
                uVar32 = this->pattern_size;
              }
              uVar34 = (ulong)(iVar28 + 1U);
            } while (iVar28 + 1U < uVar32);
          }
          uVar40 = uVar40 + 1;
        } while (uVar40 < uVar32);
        uVar40 = this->max_graphs;
        uVar47 = uVar32;
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 < uVar40);
  }
  return true;
code_r0x001264f4:
  uVar39 = uVar39 + 1;
  iVar28 = iVar28 + -0x40;
  if (uVar36 == uVar39) goto LAB_00126511;
  goto LAB_001264eb;
code_r0x00126ae1:
  uVar41 = uVar41 + 1;
  iVar38 = iVar38 + -0x40;
  if (uVar33 == uVar41) goto LAB_00126afe;
  goto LAB_00126ad8;
code_r0x00126ba6:
  uVar41 = uVar41 + 1;
  iVar38 = iVar38 + -0x40;
  if (uVar33 == uVar41) goto LAB_00126bc3;
  goto LAB_00126b9d;
code_r0x00126c24:
  uVar41 = uVar41 + 1;
  iVar38 = iVar38 + -0x40;
  if (uVar33 == uVar41) goto LAB_00126c43;
  goto LAB_00126c1b;
code_r0x00126c98:
  uVar41 = uVar41 + 1;
  iVar38 = iVar38 + -0x40;
  if (uVar33 == uVar41) goto LAB_00126cb6;
  goto LAB_00126c8f;
code_r0x0012701b:
  uVar41 = uVar41 + 1;
  iVar38 = iVar38 + -0x40;
  if (uVar33 == uVar41) goto LAB_0012703a;
  goto LAB_00127012;
code_r0x0012770b:
  lVar44 = lVar44 + -0x40;
  pSVar22 = (SVOBitset *)((long)&pSVar22->_data + 8);
  if (uVar34 * 0x40 + lVar44 == 0) goto LAB_001277aa;
  goto LAB_001276fe;
code_r0x00127795:
  uVar36 = uVar36 + 1;
  iVar38 = iVar38 + -0x40;
  if (uVar33 == uVar36) goto LAB_001277f9;
  goto LAB_0012778c;
code_r0x00128165:
  uVar33 = uVar33 + 1;
  iVar38 = iVar38 + -0x40;
  if (uVar36 == uVar33) goto LAB_00128180;
  goto LAB_0012815c;
code_r0x0012797c:
  uVar33 = uVar33 + 1;
  iVar38 = iVar38 + -0x40;
  if (uVar34 == uVar33) goto LAB_0012799a;
  goto LAB_00127973;
code_r0x00127c76:
  uVar33 = uVar33 + 1;
  iVar38 = iVar38 + -0x40;
  if (uVar34 == uVar33) goto LAB_00127c98;
  goto LAB_00127c6d;
code_r0x00127e1e:
  uVar33 = uVar33 + 1;
  iVar38 = iVar38 + -0x40;
  if (uVar34 == uVar33) goto LAB_00127e37;
  goto LAB_00127e15;
code_r0x00128568:
  uVar33 = uVar33 + 1;
  iVar38 = iVar38 + -0x40;
  if (uVar34 == uVar33) goto LAB_00128587;
  goto LAB_0012855f;
}

Assistant:

auto HomomorphismModel::prepare() -> bool
{
    if (is_nonshrinking(_imp->params) && (pattern_size > target_size))
        return false;

    _imp->supplemental_graph_names.push_back("original");

    // pattern and target degrees, for the main graph
    _imp->patterns_degrees.at(0).resize(pattern_size);
    _imp->targets_degrees.at(0).resize(target_size);

    for (unsigned i = 0; i < pattern_size; ++i)
        _imp->patterns_degrees.at(0).at(i) = _imp->pattern_graph_rows[i * max_graphs + 0].count();

    for (unsigned i = 0; i < target_size; ++i)
        _imp->targets_degrees.at(0).at(i) = _imp->target_graph_rows[i * max_graphs + 0].count();

    if (global_degree_is_preserved(_imp->params)) {
        vector<pair<int, int>> p_gds, t_gds;
        for (unsigned i = 0; i < pattern_size; ++i)
            p_gds.emplace_back(i, _imp->patterns_degrees.at(0).at(i));
        for (unsigned i = 0; i < target_size; ++i)
            t_gds.emplace_back(i, _imp->targets_degrees.at(0).at(i));

        sort(p_gds.begin(), p_gds.end(), [](const pair<int, int> & a, const pair<int, int> & b) { return a.second > b.second; });
        sort(t_gds.begin(), t_gds.end(), [](const pair<int, int> & a, const pair<int, int> & b) { return a.second > b.second; });

        for (unsigned i = 0; i < p_gds.size(); ++i)
            if (p_gds.at(i).second > t_gds.at(i).second) {
                if (_imp->proof) {
                    for (unsigned p = 0; p <= i; ++p) {
                        vector<int> n_p;
                        auto np = _imp->pattern_graph_rows[p_gds.at(p).first * max_graphs + 0];
                        for (unsigned j = 0; j < pattern_size; ++j)
                            if (np.test(j))
                                n_p.push_back(j);

                        for (unsigned t = i; t < t_gds.size(); ++t) {
                            vector<int> n_t;
                            auto nt = _imp->target_graph_rows[t_gds.at(t).first * max_graphs + 0];
                            for (auto j = nt.find_first(); j != decltype(nt)::npos; j = nt.find_first()) {
                                nt.reset(j);
                                n_t.push_back(j);
                            }

                            _imp->proof->incompatible_by_degrees(0,
                                pattern_vertex_for_proof(p_gds.at(p).first), n_p,
                                target_vertex_for_proof(t_gds.at(t).first), n_t);
                        }
                    }

                    vector<NamedVertex> patterns, targets;
                    for (unsigned p = 0; p <= i; ++p)
                        patterns.push_back(pattern_vertex_for_proof(p_gds.at(p).first));
                    for (unsigned t = 0; t < i; ++t)
                        targets.push_back(target_vertex_for_proof(t_gds.at(t).first));

                    _imp->proof->emit_hall_set_or_violator(patterns, targets);
                }
                return false;
            }
    }

    unsigned next_pattern_supplemental = 1, next_target_supplemental = 1;
    // build exact path graphs
    if (supports_exact_path_graphs(_imp->params)) {
        _build_exact_path_graphs(_imp->pattern_graph_rows, pattern_size, next_pattern_supplemental, _imp->params.number_of_exact_path_graphs, _imp->directed, false, true);
        _build_exact_path_graphs(_imp->target_graph_rows, target_size, next_target_supplemental, _imp->params.number_of_exact_path_graphs, _imp->directed, false, false);

        if (_imp->proof) {
            for (int g = 1; g <= _imp->params.number_of_exact_path_graphs; ++g) {
                for (unsigned p = 0; p < pattern_size; ++p) {
                    for (unsigned q = 0; q < pattern_size; ++q) {
                        if (p == q || ! _imp->pattern_graph_rows[p * max_graphs + g].test(q))
                            continue;

                        auto named_p = pattern_vertex_for_proof(p);
                        auto named_q = pattern_vertex_for_proof(q);

                        auto n_p_q = _imp->pattern_graph_rows[p * max_graphs + 0];
                        n_p_q &= _imp->pattern_graph_rows[q * max_graphs + 0];
                        vector<NamedVertex> between_p_and_q;
                        for (auto v = n_p_q.find_first(); v != decltype(n_p_q)::npos; v = n_p_q.find_first()) {
                            n_p_q.reset(v);
                            between_p_and_q.push_back(pattern_vertex_for_proof(v));
                            if (between_p_and_q.size() >= unsigned(g))
                                break;
                        }

                        for (unsigned t = 0; t < target_size; ++t) {
                            auto named_t = target_vertex_for_proof(t);

                            vector<NamedVertex> named_n_t, named_d_n_t;
                            vector<pair<NamedVertex, vector<NamedVertex>>> named_two_away_from_t;
                            auto n_t = _imp->target_graph_rows[t * max_graphs + 0];
                            for (auto w = n_t.find_first(); w != decltype(n_t)::npos; w = n_t.find_first()) {
                                n_t.reset(w);
                                named_n_t.push_back(target_vertex_for_proof(w));
                            }

                            auto nd_t = _imp->target_graph_rows[t * max_graphs + g];
                            for (auto w = nd_t.find_first(); w != decltype(nd_t)::npos; w = nd_t.find_first()) {
                                nd_t.reset(w);
                                named_d_n_t.push_back(target_vertex_for_proof(w));
                            }

                            auto n2_t = _imp->target_graph_rows[t * max_graphs + 1];
                            for (auto w = n2_t.find_first(); w != decltype(n2_t)::npos; w = n2_t.find_first()) {
                                n2_t.reset(w);
                                auto n_t_w = _imp->target_graph_rows[w * max_graphs + 0];
                                n_t_w &= _imp->target_graph_rows[t * max_graphs + 0];
                                vector<NamedVertex> named_n_t_w;
                                for (auto x = n_t_w.find_first(); x != decltype(n_t_w)::npos; x = n_t_w.find_first()) {
                                    n_t_w.reset(x);
                                    named_n_t_w.push_back(target_vertex_for_proof(x));
                                }
                                named_two_away_from_t.emplace_back(target_vertex_for_proof(w), named_n_t_w);
                            }

                            _imp->proof->create_exact_path_graphs(g, named_p, named_q, between_p_and_q,
                                named_t, named_n_t, named_two_away_from_t, named_d_n_t);
                        }
                    }
                }
            }
        }
    }

    if (supports_distance2_graphs(_imp->params)) {
        _build_exact_path_graphs(_imp->pattern_graph_rows, pattern_size, next_pattern_supplemental, 1, _imp->directed, true, true);
        _build_exact_path_graphs(_imp->target_graph_rows, target_size, next_target_supplemental, 1, _imp->directed, true, false);
    }

    if (supports_distance3_graphs(_imp->params)) {
        _build_distance3_graphs(_imp->pattern_graph_rows, pattern_size, next_pattern_supplemental, true);
        _build_distance3_graphs(_imp->target_graph_rows, target_size, next_target_supplemental, false);

        if (_imp->proof) {
            for (unsigned p = 0; p < pattern_size; ++p) {
                for (unsigned q = 0; q < pattern_size; ++q) {
                    auto named_p = pattern_vertex_for_proof(p);
                    auto named_q = pattern_vertex_for_proof(q);

                    // only do this if they're actually adjacent
                    if (p == q || ! _imp->pattern_graph_rows[p * max_graphs + next_pattern_supplemental - 1].test(q))
                        continue;

                    bool actually_adjacent = false;
                    optional<NamedVertex> path_from_p_to_q_1 = nullopt, path_from_p_to_q_2 = nullopt;

                    auto n_p = _imp->pattern_graph_rows[p * max_graphs + 0];

                    // are they actually distance 1 apart?
                    if (n_p.test(q))
                        actually_adjacent = true;
                    else {
                        auto n_q = _imp->pattern_graph_rows[q * max_graphs + 0];

                        auto n_p_q = n_p;
                        n_p_q &= n_q;
                        n_p_q.reset(p);
                        n_p_q.reset(q);

                        if (n_p_q.any()) {
                            // they're actually distance 2 apart
                            path_from_p_to_q_1 = pattern_vertex_for_proof(n_p_q.find_first());
                        }
                        else {
                            // find a path of length 3
                            n_p.reset(p);
                            n_p.reset(q);
                            for (auto v = n_p.find_first(); v != decltype(n_p)::npos && ! path_from_p_to_q_1; v = n_p.find_first()) {
                                n_p.reset(v);
                                auto n_v = _imp->pattern_graph_rows[v * max_graphs + 0];
                                n_v.reset(v);
                                n_v.reset(p);
                                n_v.reset(q);
                                for (auto w = n_v.find_first(); w != decltype(n_v)::npos && ! path_from_p_to_q_1; w = n_v.find_first()) {
                                    n_v.reset(w);
                                    if (_imp->pattern_graph_rows[w * max_graphs + 0].test(q)) {
                                        path_from_p_to_q_1 = pattern_vertex_for_proof(v);
                                        path_from_p_to_q_2 = pattern_vertex_for_proof(w);
                                    }
                                }
                            }
                        }

                        if (! path_from_p_to_q_1)
                            throw ProofError{"Oops, there's a bug: missing path from " + named_p.second + " to " + named_q.second};
                    }

                    for (unsigned t = 0; t < target_size; ++t) {
                        auto named_t = target_vertex_for_proof(t);

                        vector<NamedVertex> d1_from_t, d2_from_t, d3_from_t;
                        set<NamedVertex> d2_from_t_set, d3_from_t_set;
                        auto n_t = _imp->target_graph_rows[t * max_graphs + 0];
                        n_t.set(t);
                        for (auto v = n_t.find_first(); v != decltype(n_t)::npos; v = n_t.find_first()) {
                            n_t.reset(v);
                            d1_from_t.push_back(target_vertex_for_proof(v));
                            auto n_v = _imp->target_graph_rows[v * max_graphs + 0];
                            n_v.set(v);
                            for (auto w = n_v.find_first(); w != decltype(n_v)::npos; w = n_v.find_first()) {
                                n_v.reset(w);
                                d2_from_t_set.insert(target_vertex_for_proof(w));
                                auto n_w = _imp->target_graph_rows[w * max_graphs + 0];
                                n_w.set(w);
                                for (auto x = n_w.find_first(); x != decltype(n_w)::npos; x = n_w.find_first()) {
                                    n_w.reset(x);
                                    d3_from_t_set.insert(target_vertex_for_proof(x));
                                }
                            }
                        }

                        d2_from_t.assign(d2_from_t_set.begin(), d2_from_t_set.end());
                        d3_from_t.assign(d3_from_t_set.begin(), d3_from_t_set.end());

                        if (actually_adjacent)
                            _imp->proof->create_distance3_graphs_but_actually_distance_1(next_pattern_supplemental - 1, named_p, named_q, named_t, d3_from_t);
                        else if (path_from_p_to_q_2)
                            _imp->proof->create_distance3_graphs(next_pattern_supplemental - 1, named_p, named_q, *path_from_p_to_q_1,
                                *path_from_p_to_q_2, named_t, d1_from_t, d2_from_t, d3_from_t);
                        else
                            _imp->proof->create_distance3_graphs_but_actually_distance_2(next_pattern_supplemental - 1, named_p, named_q, *path_from_p_to_q_1,
                                named_t, d1_from_t, d2_from_t, d3_from_t);
                    }
                }
            }
        }
    }

    if (supports_k4_graphs(_imp->params)) {
        _build_k4_graphs(_imp->pattern_graph_rows, pattern_size, next_pattern_supplemental, true);
        _build_k4_graphs(_imp->target_graph_rows, target_size, next_target_supplemental, false);
    }

    for (auto & [shape, injective, count] : _imp->params.extra_shapes) {
        _build_extra_shape(_imp->pattern_graph_rows, pattern_size, next_pattern_supplemental, *shape, injective, count, true);
        _build_extra_shape(_imp->target_graph_rows, target_size, next_target_supplemental, *shape, injective, count, false);

        if (_imp->proof) {
            for (unsigned p = 0; p < pattern_size; ++p) {
                for (unsigned q = 0; q < pattern_size; ++q) {
                    auto named_p = pattern_vertex_for_proof(p);
                    auto named_q = pattern_vertex_for_proof(q);

                    // only do this if they're actually adjacent
                    if (! _imp->pattern_graph_rows[p * max_graphs + next_pattern_supplemental - 1].test(q))
                        continue;

                    for (unsigned t = 0; t < target_size; ++t) {
                        auto named_t = target_vertex_for_proof(t);
                        vector<NamedVertex> named_n_t;
                        auto n_t = _imp->target_graph_rows[t * max_graphs + next_pattern_supplemental - 1];
                        for (auto v = n_t.find_first(); v != decltype(n_t)::npos; v = n_t.find_first()) {
                            n_t.reset(v);
                            named_n_t.push_back(target_vertex_for_proof(v));
                        }
                        _imp->proof->hack_in_shape_graph(next_pattern_supplemental - 1, named_p, named_q, named_t, named_n_t);
                    }
                }
            }
        }
    }

    if (next_pattern_supplemental != max_graphs || next_target_supplemental != max_graphs ||
            next_pattern_supplemental != _imp->supplemental_graph_names.size())
        throw UnsupportedConfiguration{"something has gone wrong with supplemental graph indexing: " + to_string(next_pattern_supplemental) + " " + to_string(next_target_supplemental) + " " + to_string(max_graphs) + " "
        + to_string(_imp->supplemental_graph_names.size())};

    // pattern and target degrees, for supplemental graphs
    for (unsigned g = 1; g < max_graphs; ++g) {
        _imp->patterns_degrees.at(g).resize(pattern_size);
        _imp->targets_degrees.at(g).resize(target_size);
    }

    for (unsigned g = 1; g < max_graphs; ++g) {
        for (unsigned i = 0; i < pattern_size; ++i)
            _imp->patterns_degrees.at(g).at(i) = _imp->pattern_graph_rows[i * max_graphs + g].count();

        for (unsigned i = 0; i < target_size; ++i)
            _imp->targets_degrees.at(g).at(i) = _imp->target_graph_rows[i * max_graphs + g].count();
    }

    for (unsigned i = 0; i < target_size; ++i)
        _imp->largest_target_degree = max(_imp->largest_target_degree, _imp->targets_degrees[0][i]);

    // re-add loops
    for (unsigned i = 0; i < pattern_size; ++i)
        if (_imp->pattern_loops[i])
            _imp->pattern_graph_rows[i * max_graphs + 0].set(i);

    for (unsigned i = 0; i < target_size; ++i)
        if (_imp->target_loops[i])
            _imp->target_graph_rows[i * max_graphs + 0].set(i);

    // pattern adjacencies, compressed
    _imp->pattern_adjacencies_bits.resize(pattern_size * pattern_size);
    for (unsigned g = 0; g < max_graphs; ++g)
        for (unsigned i = 0; i < pattern_size; ++i)
            for (unsigned j = 0; j < pattern_size; ++j)
                if (_imp->pattern_graph_rows[i * max_graphs + g].test(j))
                    _imp->pattern_adjacencies_bits[i * pattern_size + j] |= (1u << g);

    return true;
}